

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  void *pvVar8;
  size_t sVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int *piVar24;
  void *pvVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  float *pfVar31;
  uint _w;
  float *pfVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [32];
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong uVar37;
  float *pfVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  float *pfVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar92 [64];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar193;
  float fVar197;
  float fVar198;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar185 [32];
  float fVar199;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar192;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 in_ZMM3 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar217 [16];
  float fVar216;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar259;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 in_ZMM7 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar299 [32];
  float fVar307;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  ulong local_110;
  ulong local_100;
  Mat local_a8;
  void *local_58;
  long local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  undefined1 auVar181 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [32];
  undefined1 auVar189 [32];
  undefined1 auVar246 [32];
  undefined1 auVar251 [32];
  undefined1 auVar256 [32];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  
  uVar37 = bottom_blob->elemsize;
  iVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar30 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_a8.cstep = 0;
  local_a8.data = (Allocator *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_a8.elempack = 0;
  local_a8.h = 0;
  local_a8.allocator = (Allocator *)local_a8.data;
  local_a8.dims = (int)local_a8.refcount;
  local_a8.w = local_a8.refcount._4_4_;
  local_a8.d = (int)local_a8.refcount;
  local_a8.c = local_a8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx + (long)p_Var4),bottom_blob,
             &local_a8,opt);
  iVar26 = local_a8.h;
  iVar39 = -100;
  if (((Allocator *)local_a8.data != (Allocator *)0x0) && ((long)local_a8.c * local_a8.cstep != 0))
  {
    uVar27 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    lVar40 = 1;
    if (opt->use_packing_layout == true) {
      lVar40 = 8;
      if ((uVar27 & 7) != 0) {
        lVar40 = (ulong)((uVar27 & 3) == 0) * 3 + 1;
      }
    }
    uVar41 = (ulong)(uint)local_a8.h;
    iVar29 = (int)lVar40;
    iVar3 = (local_a8.w + ~((iVar3 + -1) * iVar30)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    _w = iVar3 + 1;
    uVar27 = (int)uVar27 / iVar29;
    Mat::create(top_blob,_w,uVar27,lVar40 * (uVar37 / (ulong)(long)iVar2),iVar29,opt->blob_allocator
               );
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar44 = iVar29 == 8;
      bVar46 = 0 < (int)uVar27;
      if (iVar2 == 8 && (bVar46 && bVar44)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar273 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar215._8_4_ = 0x3f000000;
        auVar215._0_8_ = 0x3f0000003f000000;
        auVar215._12_4_ = 0x3f000000;
        auVar215._16_4_ = 0x3f000000;
        auVar215._20_4_ = 0x3f000000;
        auVar215._24_4_ = 0x3f000000;
        auVar215._28_4_ = 0x3f000000;
        auVar92 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        do {
          if (-1 < iVar3) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar283 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar283 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_110 * 0x20));
              }
              if (0 < iVar26) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)&((Allocator *)((long)local_a8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4 +
                                   4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-7];
                      fVar63 = pfVar31[-6];
                      fVar93 = pfVar31[-5];
                      fVar94 = pfVar31[-4];
                      fVar199 = pfVar31[-3];
                      fVar95 = pfVar31[-2];
                      fVar196 = pfVar31[-1];
                      fVar198 = *pfVar31;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar94,CONCAT424(fVar95 * pfVar43[0x2e],
                                                                    CONCAT420(fVar95 * pfVar43[0x2d]
                                                                              ,CONCAT416(fVar95 * 
                                                  pfVar43[0x2c],
                                                  CONCAT412(fVar95 * pfVar43[0x2b],
                                                            CONCAT48(fVar95 * pfVar43[0x2a],
                                                                     CONCAT44(fVar95 * pfVar43[0x29]
                                                                              ,fVar95 * pfVar43[0x28
                                                  ]))))))));
                      fVar197 = fVar63 + fVar93 + fVar93 + fVar94;
                      fVar144 = fVar196 * pfVar43[0x30] + fVar198 * pfVar43[0x38];
                      fVar191 = fVar196 * pfVar43[0x31] + fVar198 * pfVar43[0x39];
                      fVar192 = fVar196 * pfVar43[0x32] + fVar198 * pfVar43[0x3a];
                      fVar193 = fVar196 * pfVar43[0x33] + fVar198 * pfVar43[0x3b];
                      fVar194 = fVar196 * pfVar43[0x34] + fVar198 * pfVar43[0x3c];
                      fVar195 = fVar196 * pfVar43[0x35] + fVar198 * pfVar43[0x3d];
                      fVar196 = fVar196 * pfVar43[0x36] + fVar198 * pfVar43[0x3e];
                      fVar198 = fVar93 + fVar197;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar198,CONCAT424(fVar196,CONCAT420(fVar195,
                                                  CONCAT416(fVar194,CONCAT412(fVar193,CONCAT48(
                                                  fVar192,CONCAT44(fVar191,fVar144))))))));
                      auVar283 = ZEXT3264(CONCAT428(auVar283._28_4_ + fVar49 + fVar63 + fVar93 +
                                                    fVar197 + fVar198,
                                                    CONCAT424(auVar283._24_4_ + fVar49 * pfVar43[6]
                                                              + fVar63 * pfVar43[0xe] +
                                                                fVar93 * pfVar43[0x16] +
                                                              fVar94 * pfVar43[0x1e] +
                                                              fVar199 * pfVar43[0x26] +
                                                              fVar95 * pfVar43[0x2e] + fVar196,
                                                              CONCAT420(auVar283._20_4_ +
                                                                        fVar49 * pfVar43[5] +
                                                                        fVar63 * pfVar43[0xd] +
                                                                        fVar93 * pfVar43[0x15] +
                                                                        fVar94 * pfVar43[0x1d] +
                                                                        fVar199 * pfVar43[0x25] +
                                                                        fVar95 * pfVar43[0x2d] +
                                                                        fVar195,CONCAT416(auVar283.
                                                  _16_4_ + fVar49 * pfVar43[4] +
                                                  fVar63 * pfVar43[0xc] + fVar93 * pfVar43[0x14] +
                                                  fVar94 * pfVar43[0x1c] + fVar199 * pfVar43[0x24] +
                                                  fVar95 * pfVar43[0x2c] + fVar194,
                                                  CONCAT412(auVar283._12_4_ + fVar49 * pfVar43[3] +
                                                            fVar63 * pfVar43[0xb] +
                                                            fVar93 * pfVar43[0x13] +
                                                            fVar94 * pfVar43[0x1b] +
                                                            fVar199 * pfVar43[0x23] +
                                                            fVar95 * pfVar43[0x2b] + fVar193,
                                                            CONCAT48(auVar283._8_4_ +
                                                                     fVar49 * pfVar43[2] +
                                                                     fVar63 * pfVar43[10] +
                                                                     fVar93 * pfVar43[0x12] +
                                                                     fVar94 * pfVar43[0x1a] +
                                                                     fVar199 * pfVar43[0x22] +
                                                                     fVar95 * pfVar43[0x2a] +
                                                                     fVar192,CONCAT44(auVar283._4_4_
                                                                                      + fVar49 * 
                                                  pfVar43[1] +
                                                  fVar63 * pfVar43[9] + fVar93 * pfVar43[0x11] +
                                                  fVar94 * pfVar43[0x19] + fVar199 * pfVar43[0x21] +
                                                  fVar95 * pfVar43[0x29] + fVar191,
                                                  auVar283._0_4_ + fVar49 * *pfVar43 +
                                                  fVar63 * pfVar43[8] + fVar93 * pfVar43[0x10] +
                                                  fVar94 * pfVar43[0x18] + fVar199 * pfVar43[0x20] +
                                                  fVar95 * pfVar43[0x28] + fVar144))))))));
                      pfVar43 = pfVar43 + 0x40;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  uVar37 = uVar37 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar37 != uVar41);
              }
              auVar278 = auVar283._0_32_;
              auVar56 = auVar273._0_32_;
              fVar144 = auVar283._8_4_;
              fVar191 = auVar283._12_4_;
              fVar192 = auVar283._16_4_;
              fVar193 = auVar283._20_4_;
              fVar194 = auVar283._24_4_;
              auVar85 = auVar92._0_32_;
              fVar49 = auVar92._0_4_;
              fVar63 = auVar92._4_4_;
              fVar93 = auVar92._8_4_;
              fVar94 = auVar92._12_4_;
              fVar199 = auVar92._16_4_;
              fVar95 = auVar92._20_4_;
              fVar196 = auVar92._24_4_;
              fVar198 = auVar92._28_4_;
              auVar284._28_36_ = auVar283._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar278 = vmaxps_avx(auVar278,auVar56);
                break;
              case 2:
                auVar85 = vmaxps_avx(auVar278,auVar56);
                in_ZMM7 = ZEXT3264(auVar85);
                auVar56 = vminps_avx(auVar278,auVar56);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar278._0_4_ = fVar49 * auVar56._0_4_ + auVar85._0_4_;
                auVar278._4_4_ = fVar49 * auVar56._4_4_ + auVar85._4_4_;
                auVar278._8_4_ = fVar49 * auVar56._8_4_ + auVar85._8_4_;
                auVar278._12_4_ = fVar49 * auVar56._12_4_ + auVar85._12_4_;
                auVar278._16_4_ = fVar49 * auVar56._16_4_ + auVar85._16_4_;
                auVar278._20_4_ = fVar49 * auVar56._20_4_ + auVar85._20_4_;
                auVar278._24_4_ = fVar49 * auVar56._24_4_ + auVar85._24_4_;
                auVar278._28_4_ = auVar56._28_4_ + auVar85._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar244._4_4_ = uVar1;
                auVar244._0_4_ = uVar1;
                auVar244._8_4_ = uVar1;
                auVar244._12_4_ = uVar1;
                auVar244._16_4_ = uVar1;
                auVar244._20_4_ = uVar1;
                auVar244._24_4_ = uVar1;
                auVar244._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar299._4_4_ = uVar1;
                auVar299._0_4_ = uVar1;
                auVar299._8_4_ = uVar1;
                auVar299._12_4_ = uVar1;
                auVar299._16_4_ = uVar1;
                auVar299._20_4_ = uVar1;
                auVar299._24_4_ = uVar1;
                auVar299._28_4_ = uVar1;
                auVar278 = vmaxps_avx(auVar278,auVar244);
                in_ZMM7 = ZEXT3264(auVar278);
                auVar278 = vminps_avx(auVar299,auVar278);
                break;
              case 4:
                auVar245._0_8_ = auVar283._0_8_ ^ 0x8000000080000000;
                auVar245._8_4_ = -fVar144;
                auVar245._12_4_ = -fVar191;
                auVar245._16_4_ = -fVar192;
                auVar245._20_4_ = -fVar193;
                auVar245._24_4_ = -fVar194;
                auVar245._28_4_ = -auVar283._28_4_;
                auVar132._8_4_ = 0x42b0c0a5;
                auVar132._0_8_ = 0x42b0c0a542b0c0a5;
                auVar132._12_4_ = 0x42b0c0a5;
                auVar132._16_4_ = 0x42b0c0a5;
                auVar132._20_4_ = 0x42b0c0a5;
                auVar132._24_4_ = 0x42b0c0a5;
                auVar132._28_4_ = 0x42b0c0a5;
                auVar278 = vminps_avx(auVar245,auVar132);
                auVar133._8_4_ = 0xc2b0c0a5;
                auVar133._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar133._12_4_ = 0xc2b0c0a5;
                auVar133._16_4_ = 0xc2b0c0a5;
                auVar133._20_4_ = 0xc2b0c0a5;
                auVar133._24_4_ = 0xc2b0c0a5;
                auVar133._28_4_ = 0xc2b0c0a5;
                auVar56 = vmaxps_avx(auVar278,auVar133);
                auVar277._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                auVar277._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                auVar277._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                auVar277._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                auVar277._16_4_ = auVar56._16_4_ * 1.442695 + 0.5;
                auVar277._20_4_ = auVar56._20_4_ * 1.442695 + 0.5;
                auVar277._24_4_ = auVar56._24_4_ * 1.442695 + 0.5;
                auVar277._28_4_ = auVar283._28_4_ + 0.5;
                auVar135 = vroundps_avx(auVar277,1);
                auVar278 = vcmpps_avx(auVar277,auVar135,1);
                auVar278 = vandps_avx(auVar278,auVar85);
                auVar278 = vsubps_avx(auVar135,auVar278);
                fVar144 = auVar278._0_4_ * -0.6931472 + auVar56._0_4_;
                fVar191 = auVar278._4_4_ * -0.6931472 + auVar56._4_4_;
                fVar192 = auVar278._8_4_ * -0.6931472 + auVar56._8_4_;
                fVar193 = auVar278._12_4_ * -0.6931472 + auVar56._12_4_;
                fVar194 = auVar278._16_4_ * -0.6931472 + auVar56._16_4_;
                fVar195 = auVar278._20_4_ * -0.6931472 + auVar56._20_4_;
                fVar197 = auVar278._24_4_ * -0.6931472 + auVar56._24_4_;
                in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                             CONCAT424(0x3ab743ce,
                                                       CONCAT420(0x3ab743ce,
                                                                 CONCAT416(0x3ab743ce,
                                                                           CONCAT412(0x3ab743ce,
                                                                                     CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                auVar218._0_4_ = (int)auVar278._0_4_;
                auVar218._4_4_ = (int)auVar278._4_4_;
                auVar218._8_4_ = (int)auVar278._8_4_;
                auVar218._12_4_ = (int)auVar278._12_4_;
                auVar246._16_4_ = (int)auVar278._16_4_;
                auVar246._0_16_ = auVar218;
                auVar246._20_4_ = (int)auVar278._20_4_;
                auVar246._24_4_ = (int)auVar278._24_4_;
                auVar246._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar218,0x17);
                auVar145 = vpslld_avx(auVar246._16_16_,0x17);
                auVar50._8_4_ = 0x3f800000;
                auVar50._0_8_ = 0x3f8000003f800000;
                auVar50._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar50);
                auVar217 = vpaddd_avx(auVar217,auVar50);
                auVar134._0_4_ =
                     (fVar144 + fVar49 +
                     fVar144 * fVar144 *
                     (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144
                       + 0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5)) * auVar217._0_4_ +
                     fVar49;
                auVar134._4_4_ =
                     (fVar191 + fVar63 +
                     fVar191 * fVar191 *
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + 0.5)) * auVar217._4_4_ +
                     fVar63;
                auVar134._8_4_ =
                     (fVar192 + fVar93 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + 0.5)) * auVar217._8_4_ +
                     fVar93;
                auVar134._12_4_ =
                     (fVar193 + fVar94 +
                     fVar193 * fVar193 *
                     (((((fVar193 * 0.00019875691 + 0.0013981999) * fVar193 + 0.008333452) * fVar193
                       + 0.041665796) * fVar193 + 0.16666666) * fVar193 + 0.5)) * auVar217._12_4_ +
                     fVar94;
                auVar134._16_4_ =
                     (fVar194 + fVar199 +
                     fVar194 * fVar194 *
                     (((((fVar194 * 0.00019875691 + 0.0013981999) * fVar194 + 0.008333452) * fVar194
                       + 0.041665796) * fVar194 + 0.16666666) * fVar194 + 0.5)) * auVar145._0_4_ +
                     fVar199;
                auVar134._20_4_ =
                     (fVar195 + fVar95 +
                     fVar195 * fVar195 *
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + 0.5)) * auVar145._4_4_ +
                     fVar95;
                auVar134._24_4_ =
                     (fVar197 + fVar196 +
                     fVar197 * fVar197 *
                     (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197
                       + 0.041665796) * fVar197 + 0.16666666) * fVar197 + 0.5)) * auVar145._8_4_ +
                     fVar196;
                auVar134._28_4_ = auVar135._28_4_ + auVar56._28_4_ + fVar198 + 0.71826285 + fVar198;
                auVar56 = vrcpps_avx(auVar134);
                in_ZMM7 = ZEXT3264(auVar56);
                fVar49 = auVar56._0_4_;
                fVar63 = auVar56._4_4_;
                auVar13._4_4_ = auVar134._4_4_ * fVar63;
                auVar13._0_4_ = auVar134._0_4_ * fVar49;
                fVar93 = auVar56._8_4_;
                auVar13._8_4_ = auVar134._8_4_ * fVar93;
                fVar94 = auVar56._12_4_;
                auVar13._12_4_ = auVar134._12_4_ * fVar94;
                fVar199 = auVar56._16_4_;
                auVar13._16_4_ = auVar134._16_4_ * fVar199;
                fVar95 = auVar56._20_4_;
                auVar13._20_4_ = auVar134._20_4_ * fVar95;
                fVar196 = auVar56._24_4_;
                auVar13._24_4_ = auVar134._24_4_ * fVar196;
                auVar13._28_4_ = auVar134._28_4_;
                auVar85 = vsubps_avx(auVar85,auVar13);
                auVar278._0_4_ = fVar49 + fVar49 * auVar85._0_4_;
                auVar278._4_4_ = fVar63 + fVar63 * auVar85._4_4_;
                auVar278._8_4_ = fVar93 + fVar93 * auVar85._8_4_;
                auVar278._12_4_ = fVar94 + fVar94 * auVar85._12_4_;
                auVar278._16_4_ = fVar199 + fVar199 * auVar85._16_4_;
                auVar278._20_4_ = fVar95 + fVar95 * auVar85._20_4_;
                auVar278._24_4_ = fVar196 + fVar196 * auVar85._24_4_;
                auVar278._28_4_ = auVar56._28_4_ + auVar85._28_4_;
                break;
              case 5:
                auVar267._8_4_ = 0x42b0c0a5;
                auVar267._0_8_ = 0x42b0c0a542b0c0a5;
                auVar267._12_4_ = 0x42b0c0a5;
                auVar267._16_4_ = 0x42b0c0a5;
                auVar267._20_4_ = 0x42b0c0a5;
                auVar267._24_4_ = 0x42b0c0a5;
                auVar267._28_4_ = 0x42b0c0a5;
                auVar278 = vminps_avx(auVar278,auVar267);
                auVar270._8_4_ = 0xc2b0c0a5;
                auVar270._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar270._12_4_ = 0xc2b0c0a5;
                auVar270._16_4_ = 0xc2b0c0a5;
                auVar270._20_4_ = 0xc2b0c0a5;
                auVar270._24_4_ = 0xc2b0c0a5;
                auVar270._28_4_ = 0xc2b0c0a5;
                auVar56 = vmaxps_avx(auVar270,auVar278);
                auVar242._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                auVar242._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                auVar242._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                auVar242._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                auVar242._16_4_ = auVar56._16_4_ * 1.442695 + 0.5;
                auVar242._20_4_ = auVar56._20_4_ * 1.442695 + 0.5;
                auVar242._24_4_ = auVar56._24_4_ * 1.442695 + 0.5;
                auVar242._28_4_ = in_ZMM7._28_4_ + 0.5;
                auVar135 = vroundps_avx(auVar242,1);
                auVar278 = vcmpps_avx(auVar242,auVar135,1);
                auVar278 = vandps_avx(auVar278,auVar85);
                auVar278 = vsubps_avx(auVar135,auVar278);
                auVar10._4_4_ = auVar278._4_4_ * 0.6931472;
                auVar10._0_4_ = auVar278._0_4_ * 0.6931472;
                auVar10._8_4_ = auVar278._8_4_ * 0.6931472;
                auVar10._12_4_ = auVar278._12_4_ * 0.6931472;
                auVar10._16_4_ = auVar278._16_4_ * 0.6931472;
                auVar10._20_4_ = auVar278._20_4_ * 0.6931472;
                auVar10._24_4_ = auVar278._24_4_ * 0.6931472;
                auVar10._28_4_ = auVar135._28_4_;
                auVar56 = vsubps_avx(auVar56,auVar10);
                fVar195 = auVar56._0_4_;
                fVar197 = auVar56._4_4_;
                fVar302 = auVar56._8_4_;
                fVar303 = auVar56._12_4_;
                fVar304 = auVar56._16_4_;
                fVar305 = auVar56._20_4_;
                fVar306 = auVar56._24_4_;
                auVar145._0_4_ = (int)auVar278._0_4_;
                auVar145._4_4_ = (int)auVar278._4_4_;
                auVar145._8_4_ = (int)auVar278._8_4_;
                auVar145._12_4_ = (int)auVar278._12_4_;
                auVar174._16_4_ = (int)auVar278._16_4_;
                auVar174._0_16_ = auVar145;
                auVar174._20_4_ = (int)auVar278._20_4_;
                auVar174._24_4_ = (int)auVar278._24_4_;
                auVar174._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar145,0x17);
                auVar145 = vpslld_avx(auVar174._16_16_,0x17);
                auVar208._8_4_ = 0x3f800000;
                auVar208._0_8_ = 0x3f8000003f800000;
                auVar208._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar208);
                auVar217 = vpaddd_avx(auVar217,auVar208);
                auVar243._0_4_ =
                     (fVar195 + fVar49 +
                     fVar195 * fVar195 *
                     (((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) * fVar195
                       + 0.041665796) * fVar195 + 0.16666666) * fVar195 + 0.5)) * auVar217._0_4_ +
                     fVar49;
                auVar243._4_4_ =
                     (fVar197 + fVar63 +
                     fVar197 * fVar197 *
                     (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197
                       + 0.041665796) * fVar197 + 0.16666666) * fVar197 + 0.5)) * auVar217._4_4_ +
                     fVar63;
                auVar243._8_4_ =
                     (fVar302 + fVar93 +
                     fVar302 * fVar302 *
                     (((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) * fVar302
                       + 0.041665796) * fVar302 + 0.16666666) * fVar302 + 0.5)) * auVar217._8_4_ +
                     fVar93;
                auVar243._12_4_ =
                     (fVar303 + fVar94 +
                     fVar303 * fVar303 *
                     (((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) * fVar303
                       + 0.041665796) * fVar303 + 0.16666666) * fVar303 + 0.5)) * auVar217._12_4_ +
                     fVar94;
                auVar243._16_4_ =
                     (fVar304 + fVar199 +
                     fVar304 * fVar304 *
                     (((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) * fVar304
                       + 0.041665796) * fVar304 + 0.16666666) * fVar304 + 0.5)) * auVar145._0_4_ +
                     fVar199;
                auVar243._20_4_ =
                     (fVar305 + fVar95 +
                     fVar305 * fVar305 *
                     (((((fVar305 * 0.00019875691 + 0.0013981999) * fVar305 + 0.008333452) * fVar305
                       + 0.041665796) * fVar305 + 0.16666666) * fVar305 + 0.5)) * auVar145._4_4_ +
                     fVar95;
                auVar243._24_4_ =
                     (fVar306 + fVar196 +
                     fVar306 * fVar306 *
                     (((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) * fVar306
                       + 0.041665796) * fVar306 + 0.16666666) * fVar306 + 0.5)) * auVar145._8_4_ +
                     fVar196;
                auVar243._28_4_ =
                     auVar56._28_4_ + fVar198 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
                     fVar198;
                auVar129._8_4_ = 0x800000;
                auVar129._0_8_ = 0x80000000800000;
                auVar129._12_4_ = 0x800000;
                auVar129._16_4_ = 0x800000;
                auVar129._20_4_ = 0x800000;
                auVar129._24_4_ = 0x800000;
                auVar129._28_4_ = 0x800000;
                auVar135 = vmaxps_avx(auVar243,auVar129);
                auVar145 = vpsrld_avx(auVar135._16_16_,0x17);
                auVar206._8_4_ = 0x807fffff;
                auVar206._0_8_ = 0x807fffff807fffff;
                auVar206._12_4_ = 0x807fffff;
                auVar206._16_4_ = 0x807fffff;
                auVar206._20_4_ = 0x807fffff;
                auVar206._24_4_ = 0x807fffff;
                auVar206._28_4_ = 0x807fffff;
                auVar278 = vandps_avx(auVar135,auVar206);
                auVar180 = vorps_avx(auVar278,auVar215);
                auVar207._8_4_ = 0x3f3504f3;
                auVar207._0_8_ = 0x3f3504f33f3504f3;
                auVar207._12_4_ = 0x3f3504f3;
                auVar207._16_4_ = 0x3f3504f3;
                auVar207._20_4_ = 0x3f3504f3;
                auVar207._24_4_ = 0x3f3504f3;
                auVar207._28_4_ = 0x3f3504f3;
                auVar56 = vcmpps_avx(auVar207,auVar180,2);
                auVar278 = vandnps_avx(auVar56,auVar180);
                fVar195 = auVar180._0_4_ + -1.0 + auVar278._0_4_;
                fVar197 = auVar180._4_4_ + -1.0 + auVar278._4_4_;
                fVar302 = auVar180._8_4_ + -1.0 + auVar278._8_4_;
                fVar303 = auVar180._12_4_ + -1.0 + auVar278._12_4_;
                fVar304 = auVar180._16_4_ + -1.0 + auVar278._16_4_;
                fVar305 = auVar180._20_4_ + -1.0 + auVar278._20_4_;
                fVar306 = auVar180._24_4_ + -1.0 + auVar278._24_4_;
                auVar145 = vpsubd_avx(auVar145,auVar56._16_16_);
                auVar217 = vpsrld_avx(auVar135._0_16_,0x17);
                auVar263._8_4_ = 0xffffff81;
                auVar263._0_8_ = 0xffffff81ffffff81;
                auVar263._12_4_ = 0xffffff81;
                auVar145 = vpaddd_avx(auVar263,auVar145);
                auVar217 = vpsubd_avx(auVar217,auVar56._0_16_);
                auVar217 = vpaddd_avx(auVar263,auVar217);
                auVar130._16_16_ = auVar145;
                auVar130._0_16_ = auVar217;
                auVar56 = vcmpps_avx(auVar243,_DAT_0051b720,2);
                auVar135 = vcvtdq2ps_avx(auVar130);
                auVar11._4_4_ =
                     (fVar197 + auVar135._4_4_ * 0.6931472 +
                     fVar197 * fVar197 *
                     (fVar197 * (fVar197 * (fVar197 * (fVar197 * (fVar197 * (fVar197 * (fVar197 * (
                                                  fVar197 * (fVar197 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar11._0_4_ =
                     (fVar195 + auVar135._0_4_ * 0.6931472 +
                     fVar195 * fVar195 *
                     (fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * (
                                                  fVar195 * (fVar195 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar11._8_4_ =
                     (fVar302 + auVar135._8_4_ * 0.6931472 +
                     fVar302 * fVar302 *
                     (fVar302 * (fVar302 * (fVar302 * (fVar302 * (fVar302 * (fVar302 * (fVar302 * (
                                                  fVar302 * (fVar302 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar11._12_4_ =
                     (fVar303 + auVar135._12_4_ * 0.6931472 +
                     fVar303 * fVar303 *
                     (fVar303 * (fVar303 * (fVar303 * (fVar303 * (fVar303 * (fVar303 * (fVar303 * (
                                                  fVar303 * (fVar303 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar11._16_4_ =
                     (fVar304 + auVar135._16_4_ * 0.6931472 +
                     fVar304 * fVar304 *
                     (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * (
                                                  fVar304 * (fVar304 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar11._20_4_ =
                     (fVar305 + auVar135._20_4_ * 0.6931472 +
                     fVar305 * fVar305 *
                     (fVar305 * (fVar305 * (fVar305 * (fVar305 * (fVar305 * (fVar305 * (fVar305 * (
                                                  fVar305 * (fVar305 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar11._24_4_ =
                     (fVar306 + auVar135._24_4_ * 0.6931472 +
                     fVar306 * fVar306 *
                     (fVar306 * (fVar306 * (fVar306 * (fVar306 * (fVar306 * (fVar306 * (fVar306 * (
                                                  fVar306 * (fVar306 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar11._28_4_ = auVar180._28_4_ + -1.0 + auVar278._28_4_ + auVar135._28_4_ + 0.0;
                auVar175._8_4_ = 0x7fffffff;
                auVar175._0_8_ = 0x7fffffff7fffffff;
                auVar175._12_4_ = 0x7fffffff;
                auVar175._16_4_ = 0x7fffffff;
                auVar175._20_4_ = 0x7fffffff;
                auVar175._24_4_ = 0x7fffffff;
                auVar175._28_4_ = 0x7fffffff;
                auVar278 = vblendvps_avx(auVar11,auVar175,auVar56);
                auVar176._8_4_ = 0x42b0c0a5;
                auVar176._0_8_ = 0x42b0c0a542b0c0a5;
                auVar176._12_4_ = 0x42b0c0a5;
                auVar176._16_4_ = 0x42b0c0a5;
                auVar176._20_4_ = 0x42b0c0a5;
                auVar176._24_4_ = 0x42b0c0a5;
                auVar176._28_4_ = 0x42b0c0a5;
                auVar278 = vminps_avx(auVar278,auVar176);
                auVar177._8_4_ = 0xc2b0c0a5;
                auVar177._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar177._12_4_ = 0xc2b0c0a5;
                auVar177._16_4_ = 0xc2b0c0a5;
                auVar177._20_4_ = 0xc2b0c0a5;
                auVar177._24_4_ = 0xc2b0c0a5;
                auVar177._28_4_ = 0xc2b0c0a5;
                auVar56 = vmaxps_avx(auVar278,auVar177);
                auVar273 = ZEXT864(0) << 0x20;
                auVar178._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
                auVar178._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
                auVar178._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
                auVar178._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
                auVar178._16_4_ = auVar56._16_4_ * 1.442695 + 0.5;
                auVar178._20_4_ = auVar56._20_4_ * 1.442695 + 0.5;
                auVar178._24_4_ = auVar56._24_4_ * 1.442695 + 0.5;
                auVar178._28_4_ = 0xc2afc0a5;
                auVar135 = vroundps_avx(auVar178,1);
                auVar278 = vcmpps_avx(auVar178,auVar135,1);
                auVar278 = vandps_avx(auVar278,auVar85);
                auVar278 = vsubps_avx(auVar135,auVar278);
                auVar12._4_4_ = auVar278._4_4_ * 0.6931472;
                auVar12._0_4_ = auVar278._0_4_ * 0.6931472;
                auVar12._8_4_ = auVar278._8_4_ * 0.6931472;
                auVar12._12_4_ = auVar278._12_4_ * 0.6931472;
                auVar12._16_4_ = auVar278._16_4_ * 0.6931472;
                auVar12._20_4_ = auVar278._20_4_ * 0.6931472;
                auVar12._24_4_ = auVar278._24_4_ * 0.6931472;
                auVar12._28_4_ = auVar135._28_4_;
                auVar56 = vsubps_avx(auVar56,auVar12);
                fVar195 = auVar56._0_4_;
                fVar197 = auVar56._4_4_;
                fVar302 = auVar56._8_4_;
                fVar303 = auVar56._12_4_;
                fVar304 = auVar56._16_4_;
                fVar305 = auVar56._20_4_;
                fVar306 = auVar56._24_4_;
                auVar92 = ZEXT3264(auVar85);
                fVar216 = ((((fVar195 * 0.00019875691 + 0.0013981999) * fVar195 + 0.008333452) *
                            fVar195 + 0.041665796) * fVar195 + 0.16666666) * fVar195 + 0.5;
                fVar257 = ((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) *
                            fVar197 + 0.041665796) * fVar197 + 0.16666666) * fVar197 + 0.5;
                fVar258 = ((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) *
                            fVar302 + 0.041665796) * fVar302 + 0.16666666) * fVar302 + 0.5;
                fVar259 = ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) *
                            fVar303 + 0.041665796) * fVar303 + 0.16666666) * fVar303 + 0.5;
                fVar260 = ((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) *
                            fVar304 + 0.041665796) * fVar304 + 0.16666666) * fVar304 + 0.5;
                fVar261 = ((((fVar305 * 0.00019875691 + 0.0013981999) * fVar305 + 0.008333452) *
                            fVar305 + 0.041665796) * fVar305 + 0.16666666) * fVar305 + 0.5;
                fVar262 = ((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) *
                            fVar306 + 0.041665796) * fVar306 + 0.16666666) * fVar306 + 0.5;
                in_ZMM7 = ZEXT3264(CONCAT428(auVar243._28_4_ + 0.0013981999 + 0.008333452 +
                                             0.041665796 + 0.16666666 + 0.5,
                                             CONCAT424(fVar262,CONCAT420(fVar261,CONCAT416(fVar260,
                                                  CONCAT412(fVar259,CONCAT48(fVar258,CONCAT44(
                                                  fVar257,fVar216))))))));
                auVar217._0_4_ = (int)auVar278._0_4_;
                auVar217._4_4_ = (int)auVar278._4_4_;
                auVar217._8_4_ = (int)auVar278._8_4_;
                auVar217._12_4_ = (int)auVar278._12_4_;
                auVar179._16_4_ = (int)auVar278._16_4_;
                auVar179._0_16_ = auVar217;
                auVar179._20_4_ = (int)auVar278._20_4_;
                auVar179._24_4_ = (int)auVar278._24_4_;
                auVar179._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar217,0x17);
                auVar145 = vpslld_avx(auVar179._16_16_,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar208);
                auVar217 = vpaddd_avx(auVar217,auVar208);
                auVar131._0_4_ =
                     (fVar195 + fVar49 + fVar195 * fVar195 * fVar216) * auVar217._0_4_ + fVar49;
                auVar131._4_4_ =
                     (fVar197 + fVar63 + fVar197 * fVar197 * fVar257) * auVar217._4_4_ + fVar63;
                auVar131._8_4_ =
                     (fVar302 + fVar93 + fVar302 * fVar302 * fVar258) * auVar217._8_4_ + fVar93;
                auVar131._12_4_ =
                     (fVar303 + fVar94 + fVar303 * fVar303 * fVar259) * auVar217._12_4_ + fVar94;
                auVar131._16_4_ =
                     (fVar304 + fVar199 + fVar304 * fVar304 * fVar260) * auVar145._0_4_ + fVar199;
                auVar131._20_4_ =
                     (fVar305 + fVar95 + fVar305 * fVar305 * fVar261) * auVar145._4_4_ + fVar95;
                auVar131._24_4_ =
                     (fVar306 + fVar196 + fVar306 * fVar306 * fVar262) * auVar145._8_4_ + fVar196;
                auVar131._28_4_ = auVar56._28_4_ + fVar198 + auVar135._28_4_ + fVar198;
                auVar278 = vrcpps_avx(auVar131);
                fVar49 = auVar278._0_4_;
                fVar63 = auVar278._4_4_;
                fVar93 = auVar278._8_4_;
                fVar94 = auVar278._12_4_;
                fVar199 = auVar278._16_4_;
                fVar95 = auVar278._20_4_;
                fVar196 = auVar278._24_4_;
                auVar85._4_4_ = auVar131._4_4_ * (fVar63 + fVar63);
                auVar85._0_4_ = auVar131._0_4_ * (fVar49 + fVar49);
                auVar85._8_4_ = auVar131._8_4_ * (fVar93 + fVar93);
                auVar85._12_4_ = auVar131._12_4_ * (fVar94 + fVar94);
                auVar85._16_4_ = auVar131._16_4_ * (fVar199 + fVar199);
                auVar85._20_4_ = auVar131._20_4_ * (fVar95 + fVar95);
                auVar85._24_4_ = auVar131._24_4_ * (fVar196 + fVar196);
                auVar85._28_4_ = auVar131._28_4_;
                auVar56._8_4_ = 0x40000000;
                auVar56._0_8_ = 0x4000000040000000;
                auVar56._12_4_ = 0x40000000;
                auVar56._16_4_ = 0x40000000;
                auVar56._20_4_ = 0x40000000;
                auVar56._24_4_ = 0x40000000;
                auVar56._28_4_ = 0x40000000;
                auVar85 = vsubps_avx(auVar56,auVar85);
                auVar180._0_4_ = fVar49 + fVar49 + -1.0;
                auVar180._4_4_ = fVar63 + fVar63 + -1.0;
                auVar180._8_4_ = fVar93 + fVar93 + -1.0;
                auVar180._12_4_ = fVar94 + fVar94 + -1.0;
                auVar180._16_4_ = fVar199 + fVar199 + -1.0;
                auVar180._20_4_ = fVar95 + fVar95 + -1.0;
                auVar180._24_4_ = fVar196 + fVar196 + -1.0;
                auVar180._28_4_ = auVar278._28_4_ + auVar278._28_4_ + -1.0;
                auVar126._0_4_ = auVar180._0_4_ + fVar49 * auVar85._0_4_;
                auVar126._4_4_ = auVar180._4_4_ + fVar63 * auVar85._4_4_;
                auVar126._8_4_ = auVar180._8_4_ + fVar93 * auVar85._8_4_;
                auVar126._12_4_ = auVar180._12_4_ + fVar94 * auVar85._12_4_;
                auVar126._16_4_ = auVar180._16_4_ + fVar199 * auVar85._16_4_;
                auVar126._20_4_ = auVar180._20_4_ + fVar95 * auVar85._20_4_;
                auVar126._24_4_ = auVar180._24_4_ + fVar196 * auVar85._24_4_;
                goto LAB_004fb597;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar180._4_4_ = fVar63;
                auVar180._0_4_ = fVar63;
                auVar180._8_4_ = fVar63;
                auVar180._12_4_ = fVar63;
                auVar180._16_4_ = fVar63;
                auVar180._20_4_ = fVar63;
                auVar180._24_4_ = fVar63;
                auVar180._28_4_ = fVar63;
                auVar135._0_4_ = auVar283._0_4_ * fVar49 + fVar63;
                auVar135._4_4_ = auVar283._4_4_ * fVar49 + fVar63;
                auVar135._8_4_ = fVar144 * fVar49 + fVar63;
                auVar135._12_4_ = fVar191 * fVar49 + fVar63;
                auVar135._16_4_ = fVar192 * fVar49 + fVar63;
                auVar135._20_4_ = fVar193 * fVar49 + fVar63;
                auVar135._24_4_ = fVar194 * fVar49 + fVar63;
                auVar135._28_4_ = fVar49 + fVar63;
                auVar278 = vmaxps_avx(auVar56,auVar135);
                auVar278 = vminps_avx(auVar278,auVar85);
                auVar126 = auVar278._0_28_;
LAB_004fb597:
                in_ZMM3 = ZEXT3264(auVar180);
                auVar284._0_4_ = auVar283._0_4_ * auVar126._0_4_;
                auVar284._4_4_ = auVar283._4_4_ * auVar126._4_4_;
                auVar284._8_4_ = fVar144 * auVar126._8_4_;
                auVar284._12_4_ = fVar191 * auVar126._12_4_;
                auVar284._16_4_ = fVar192 * auVar126._16_4_;
                auVar284._20_4_ = fVar193 * auVar126._20_4_;
                auVar284._24_4_ = fVar194 * auVar126._24_4_;
                auVar278 = auVar284._0_32_;
              }
              *pauVar34 = auVar278;
              pauVar34 = pauVar34 + 1;
              iVar39 = iVar39 + 8;
              bVar45 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar45);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar27);
      }
      if (iVar2 == 1 && (bVar46 && bVar44)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar37 = 0;
        auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar283 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar273 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar268._8_4_ = 0x42b0c0a5;
        auVar268._0_8_ = 0x42b0c0a542b0c0a5;
        auVar268._12_4_ = 0x42b0c0a5;
        auVar268._16_4_ = 0x42b0c0a5;
        auVar268._20_4_ = 0x42b0c0a5;
        auVar268._24_4_ = 0x42b0c0a5;
        auVar268._28_4_ = 0x42b0c0a5;
        auVar271._8_4_ = 0xc2b0c0a5;
        auVar271._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar271._12_4_ = 0xc2b0c0a5;
        auVar271._16_4_ = 0xc2b0c0a5;
        auVar271._20_4_ = 0xc2b0c0a5;
        auVar271._24_4_ = 0xc2b0c0a5;
        auVar271._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar37 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar284 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar284 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar37 * 0x20))
                ;
              }
              if (0 < iVar26) {
                pfVar32 = (float *)((this->weight_data_packed).cstep * uVar37 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)local_a8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                uVar36 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar43;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = *pfVar31;
                      auVar284 = ZEXT3264(CONCAT428(auVar284._28_4_ + fVar49,
                                                    CONCAT424(auVar284._24_4_ + fVar49 * pfVar32[6],
                                                              CONCAT420(auVar284._20_4_ +
                                                                        fVar49 * pfVar32[5],
                                                                        CONCAT416(auVar284._16_4_ +
                                                                                  fVar49 * pfVar32[4
                                                  ],CONCAT412(auVar284._12_4_ + fVar49 * pfVar32[3],
                                                              CONCAT48(auVar284._8_4_ +
                                                                       fVar49 * pfVar32[2],
                                                                       CONCAT44(auVar284._4_4_ +
                                                                                fVar49 * pfVar32[1],
                                                                                auVar284._0_4_ +
                                                                                fVar49 * *pfVar32)))
                                                  )))));
                      pfVar32 = pfVar32 + 8;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar36 = uVar36 + 1;
                  pfVar43 = (float *)((long)pfVar43 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar36 != uVar41);
              }
              auVar280 = auVar284._0_32_;
              fVar303 = auVar284._8_4_;
              fVar304 = auVar284._12_4_;
              fVar305 = auVar284._16_4_;
              fVar306 = auVar284._20_4_;
              fVar216 = auVar284._24_4_;
              fVar144 = auVar283._0_4_;
              fVar191 = auVar283._4_4_;
              fVar192 = auVar283._8_4_;
              fVar193 = auVar283._12_4_;
              fVar194 = auVar283._16_4_;
              fVar195 = auVar283._20_4_;
              fVar197 = auVar283._24_4_;
              fVar302 = auVar283._28_4_;
              auVar215 = auVar273._0_32_;
              fVar49 = auVar273._0_4_;
              fVar63 = auVar273._4_4_;
              fVar93 = auVar273._8_4_;
              fVar94 = auVar273._12_4_;
              fVar199 = auVar273._16_4_;
              fVar95 = auVar273._20_4_;
              fVar196 = auVar273._24_4_;
              fVar198 = auVar273._28_4_;
              auVar285._28_36_ = auVar284._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar280 = vmaxps_avx(auVar280,auVar92._0_32_);
                break;
              case 2:
                auVar215 = vmaxps_avx(auVar280,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar215);
                auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar278 = vminps_avx(auVar280,ZEXT1632(ZEXT816(0) << 0x40));
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar280._0_4_ = fVar49 * auVar278._0_4_ + auVar215._0_4_;
                auVar280._4_4_ = fVar49 * auVar278._4_4_ + auVar215._4_4_;
                auVar280._8_4_ = fVar49 * auVar278._8_4_ + auVar215._8_4_;
                auVar280._12_4_ = fVar49 * auVar278._12_4_ + auVar215._12_4_;
                auVar280._16_4_ = fVar49 * auVar278._16_4_ + auVar215._16_4_;
                auVar280._20_4_ = fVar49 * auVar278._20_4_ + auVar215._20_4_;
                auVar280._24_4_ = fVar49 * auVar278._24_4_ + auVar215._24_4_;
                auVar280._28_4_ = auVar278._28_4_ + auVar215._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar249._4_4_ = uVar1;
                auVar249._0_4_ = uVar1;
                auVar249._8_4_ = uVar1;
                auVar249._12_4_ = uVar1;
                auVar249._16_4_ = uVar1;
                auVar249._20_4_ = uVar1;
                auVar249._24_4_ = uVar1;
                auVar249._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar300._4_4_ = uVar1;
                auVar300._0_4_ = uVar1;
                auVar300._8_4_ = uVar1;
                auVar300._12_4_ = uVar1;
                auVar300._16_4_ = uVar1;
                auVar300._20_4_ = uVar1;
                auVar300._24_4_ = uVar1;
                auVar300._28_4_ = uVar1;
                auVar215 = vmaxps_avx(auVar280,auVar249);
                in_ZMM7 = ZEXT3264(auVar215);
                auVar280 = vminps_avx(auVar300,auVar215);
                break;
              case 4:
                auVar250._0_8_ = auVar284._0_8_ ^ 0x8000000080000000;
                auVar250._8_4_ = -fVar303;
                auVar250._12_4_ = -fVar304;
                auVar250._16_4_ = -fVar305;
                auVar250._20_4_ = -fVar306;
                auVar250._24_4_ = -fVar216;
                auVar250._28_4_ = -auVar284._28_4_;
                auVar87._8_4_ = 0x42b0c0a5;
                auVar87._0_8_ = 0x42b0c0a542b0c0a5;
                auVar87._12_4_ = 0x42b0c0a5;
                auVar87._16_4_ = 0x42b0c0a5;
                auVar87._20_4_ = 0x42b0c0a5;
                auVar87._24_4_ = 0x42b0c0a5;
                auVar87._28_4_ = 0x42b0c0a5;
                auVar278 = vminps_avx(auVar250,auVar87);
                auVar88._8_4_ = 0xc2b0c0a5;
                auVar88._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar88._12_4_ = 0xc2b0c0a5;
                auVar88._16_4_ = 0xc2b0c0a5;
                auVar88._20_4_ = 0xc2b0c0a5;
                auVar88._24_4_ = 0xc2b0c0a5;
                auVar88._28_4_ = 0xc2b0c0a5;
                auVar85 = vmaxps_avx(auVar278,auVar88);
                auVar279._0_4_ = auVar85._0_4_ * 1.442695 + fVar144;
                auVar279._4_4_ = auVar85._4_4_ * 1.442695 + fVar191;
                auVar279._8_4_ = auVar85._8_4_ * 1.442695 + fVar192;
                auVar279._12_4_ = auVar85._12_4_ * 1.442695 + fVar193;
                auVar279._16_4_ = auVar85._16_4_ * 1.442695 + fVar194;
                auVar279._20_4_ = auVar85._20_4_ * 1.442695 + fVar195;
                auVar279._24_4_ = auVar85._24_4_ * 1.442695 + fVar197;
                auVar279._28_4_ = auVar284._28_4_ + fVar302;
                auVar56 = vroundps_avx(auVar279,1);
                auVar278 = vcmpps_avx(auVar279,auVar56,1);
                auVar278 = vandps_avx(auVar278,auVar215);
                auVar278 = vsubps_avx(auVar56,auVar278);
                fVar303 = auVar278._0_4_ * -0.6931472 + auVar85._0_4_;
                fVar304 = auVar278._4_4_ * -0.6931472 + auVar85._4_4_;
                fVar305 = auVar278._8_4_ * -0.6931472 + auVar85._8_4_;
                fVar306 = auVar278._12_4_ * -0.6931472 + auVar85._12_4_;
                fVar216 = auVar278._16_4_ * -0.6931472 + auVar85._16_4_;
                fVar257 = auVar278._20_4_ * -0.6931472 + auVar85._20_4_;
                fVar258 = auVar278._24_4_ * -0.6931472 + auVar85._24_4_;
                auVar219._0_4_ = (int)auVar278._0_4_;
                auVar219._4_4_ = (int)auVar278._4_4_;
                auVar219._8_4_ = (int)auVar278._8_4_;
                auVar219._12_4_ = (int)auVar278._12_4_;
                auVar251._16_4_ = (int)auVar278._16_4_;
                auVar251._0_16_ = auVar219;
                auVar251._20_4_ = (int)auVar278._20_4_;
                auVar251._24_4_ = (int)auVar278._24_4_;
                auVar251._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar219,0x17);
                auVar145 = vpslld_avx(auVar251._16_16_,0x17);
                auVar65._8_4_ = 0x3f800000;
                auVar65._0_8_ = 0x3f8000003f800000;
                auVar65._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar65);
                auVar217 = vpaddd_avx(auVar217,auVar65);
                auVar138._0_4_ =
                     (fVar303 + fVar49 +
                     fVar303 * fVar303 *
                     (fVar144 +
                     ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) * fVar303
                      + 0.041665796) * fVar303 + 0.16666666) * fVar303)) * auVar217._0_4_ + fVar49;
                auVar138._4_4_ =
                     (fVar304 + fVar63 +
                     fVar304 * fVar304 *
                     (fVar191 +
                     ((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) * fVar304
                      + 0.041665796) * fVar304 + 0.16666666) * fVar304)) * auVar217._4_4_ + fVar63;
                auVar138._8_4_ =
                     (fVar305 + fVar93 +
                     fVar305 * fVar305 *
                     (fVar192 +
                     ((((fVar305 * 0.00019875691 + 0.0013981999) * fVar305 + 0.008333452) * fVar305
                      + 0.041665796) * fVar305 + 0.16666666) * fVar305)) * auVar217._8_4_ + fVar93;
                auVar138._12_4_ =
                     (fVar306 + fVar94 +
                     fVar306 * fVar306 *
                     (fVar193 +
                     ((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) * fVar306
                      + 0.041665796) * fVar306 + 0.16666666) * fVar306)) * auVar217._12_4_ + fVar94;
                auVar138._16_4_ =
                     (fVar216 + fVar199 +
                     fVar216 * fVar216 *
                     (fVar194 +
                     ((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216
                      + 0.041665796) * fVar216 + 0.16666666) * fVar216)) * auVar145._0_4_ + fVar199;
                auVar138._20_4_ =
                     (fVar257 + fVar95 +
                     fVar257 * fVar257 *
                     (fVar195 +
                     ((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257
                      + 0.041665796) * fVar257 + 0.16666666) * fVar257)) * auVar145._4_4_ + fVar95;
                auVar138._24_4_ =
                     (fVar258 + fVar196 +
                     fVar258 * fVar258 *
                     (fVar197 +
                     ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258
                      + 0.041665796) * fVar258 + 0.16666666) * fVar258)) * auVar145._8_4_ + fVar196;
                auVar138._28_4_ =
                     auVar56._28_4_ + auVar85._28_4_ + fVar198 + fVar302 + -0.47508308 + fVar198;
                auVar278 = vrcpps_avx(auVar138);
                in_ZMM7 = ZEXT3264(auVar278);
                fVar49 = auVar278._0_4_;
                fVar63 = auVar278._4_4_;
                auVar18._4_4_ = auVar138._4_4_ * fVar63;
                auVar18._0_4_ = auVar138._0_4_ * fVar49;
                fVar93 = auVar278._8_4_;
                auVar18._8_4_ = auVar138._8_4_ * fVar93;
                fVar94 = auVar278._12_4_;
                auVar18._12_4_ = auVar138._12_4_ * fVar94;
                fVar199 = auVar278._16_4_;
                auVar18._16_4_ = auVar138._16_4_ * fVar199;
                fVar95 = auVar278._20_4_;
                auVar18._20_4_ = auVar138._20_4_ * fVar95;
                fVar196 = auVar278._24_4_;
                auVar18._24_4_ = auVar138._24_4_ * fVar196;
                auVar18._28_4_ = auVar138._28_4_;
                auVar215 = vsubps_avx(auVar215,auVar18);
                auVar280._0_4_ = fVar49 + fVar49 * auVar215._0_4_;
                auVar280._4_4_ = fVar63 + fVar63 * auVar215._4_4_;
                auVar280._8_4_ = fVar93 + fVar93 * auVar215._8_4_;
                auVar280._12_4_ = fVar94 + fVar94 * auVar215._12_4_;
                auVar280._16_4_ = fVar199 + fVar199 * auVar215._16_4_;
                auVar280._20_4_ = fVar95 + fVar95 * auVar215._20_4_;
                auVar280._24_4_ = fVar196 + fVar196 * auVar215._24_4_;
                auVar280._28_4_ = auVar278._28_4_ + auVar215._28_4_;
                break;
              case 5:
                auVar278 = vminps_avx(auVar280,auVar268);
                auVar85 = vmaxps_avx(auVar271,auVar278);
                auVar247._0_4_ = fVar144 + auVar85._0_4_ * 1.442695;
                auVar247._4_4_ = fVar191 + auVar85._4_4_ * 1.442695;
                auVar247._8_4_ = fVar192 + auVar85._8_4_ * 1.442695;
                auVar247._12_4_ = fVar193 + auVar85._12_4_ * 1.442695;
                auVar247._16_4_ = fVar194 + auVar85._16_4_ * 1.442695;
                auVar247._20_4_ = fVar195 + auVar85._20_4_ * 1.442695;
                auVar247._24_4_ = fVar197 + auVar85._24_4_ * 1.442695;
                auVar247._28_4_ = fVar302 + in_ZMM7._28_4_;
                auVar56 = vroundps_avx(auVar247,1);
                auVar278 = vcmpps_avx(auVar247,auVar56,1);
                auVar278 = vandps_avx(auVar278,auVar215);
                auVar278 = vsubps_avx(auVar56,auVar278);
                auVar14._4_4_ = auVar278._4_4_ * 0.6931472;
                auVar14._0_4_ = auVar278._0_4_ * 0.6931472;
                auVar14._8_4_ = auVar278._8_4_ * 0.6931472;
                auVar14._12_4_ = auVar278._12_4_ * 0.6931472;
                auVar14._16_4_ = auVar278._16_4_ * 0.6931472;
                auVar14._20_4_ = auVar278._20_4_ * 0.6931472;
                auVar14._24_4_ = auVar278._24_4_ * 0.6931472;
                auVar14._28_4_ = auVar56._28_4_;
                auVar85 = vsubps_avx(auVar85,auVar14);
                fVar257 = auVar85._0_4_;
                fVar258 = auVar85._4_4_;
                fVar259 = auVar85._8_4_;
                fVar260 = auVar85._12_4_;
                fVar261 = auVar85._16_4_;
                fVar262 = auVar85._20_4_;
                fVar307 = auVar85._24_4_;
                auVar146._0_4_ = (int)auVar278._0_4_;
                auVar146._4_4_ = (int)auVar278._4_4_;
                auVar146._8_4_ = (int)auVar278._8_4_;
                auVar146._12_4_ = (int)auVar278._12_4_;
                auVar181._16_4_ = (int)auVar278._16_4_;
                auVar181._0_16_ = auVar146;
                auVar181._20_4_ = (int)auVar278._20_4_;
                auVar181._24_4_ = (int)auVar278._24_4_;
                auVar181._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar146,0x17);
                auVar145 = vpslld_avx(auVar181._16_16_,0x17);
                auVar209._8_4_ = 0x3f800000;
                auVar209._0_8_ = 0x3f8000003f800000;
                auVar209._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar209);
                auVar217 = vpaddd_avx(auVar217,auVar209);
                auVar248._0_4_ =
                     (fVar257 + fVar49 +
                     fVar257 * fVar257 *
                     (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257
                       + 0.041665796) * fVar257 + 0.16666666) * fVar257 + fVar144)) * auVar217._0_4_
                     + fVar49;
                auVar248._4_4_ =
                     (fVar258 + fVar63 +
                     fVar258 * fVar258 *
                     (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258
                       + 0.041665796) * fVar258 + 0.16666666) * fVar258 + fVar191)) * auVar217._4_4_
                     + fVar63;
                auVar248._8_4_ =
                     (fVar259 + fVar93 +
                     fVar259 * fVar259 *
                     (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259
                       + 0.041665796) * fVar259 + 0.16666666) * fVar259 + fVar192)) * auVar217._8_4_
                     + fVar93;
                auVar248._12_4_ =
                     (fVar260 + fVar94 +
                     fVar260 * fVar260 *
                     (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260
                       + 0.041665796) * fVar260 + 0.16666666) * fVar260 + fVar193)) *
                     auVar217._12_4_ + fVar94;
                auVar248._16_4_ =
                     (fVar261 + fVar199 +
                     fVar261 * fVar261 *
                     (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261
                       + 0.041665796) * fVar261 + 0.16666666) * fVar261 + fVar194)) * auVar145._0_4_
                     + fVar199;
                auVar248._20_4_ =
                     (fVar262 + fVar95 +
                     fVar262 * fVar262 *
                     (((((fVar262 * 0.00019875691 + 0.0013981999) * fVar262 + 0.008333452) * fVar262
                       + 0.041665796) * fVar262 + 0.16666666) * fVar262 + fVar195)) * auVar145._4_4_
                     + fVar95;
                auVar248._24_4_ =
                     (fVar307 + fVar196 +
                     fVar307 * fVar307 *
                     (((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307
                       + 0.041665796) * fVar307 + 0.16666666) * fVar307 + fVar197)) * auVar145._8_4_
                     + fVar196;
                auVar248._28_4_ =
                     auVar85._28_4_ + fVar198 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar302 + fVar198;
                auVar57._8_4_ = 0x800000;
                auVar57._0_8_ = 0x80000000800000;
                auVar57._12_4_ = 0x800000;
                auVar57._16_4_ = 0x800000;
                auVar57._20_4_ = 0x800000;
                auVar57._24_4_ = 0x800000;
                auVar57._28_4_ = 0x800000;
                auVar56 = vmaxps_avx(auVar248,auVar57);
                auVar145 = vpsrld_avx(auVar56._16_16_,0x17);
                auVar58._8_4_ = 0x807fffff;
                auVar58._0_8_ = 0x807fffff807fffff;
                auVar58._12_4_ = 0x807fffff;
                auVar58._16_4_ = 0x807fffff;
                auVar58._20_4_ = 0x807fffff;
                auVar58._24_4_ = 0x807fffff;
                auVar58._28_4_ = 0x807fffff;
                auVar278 = vandps_avx(auVar56,auVar58);
                auVar135 = vorps_avx(auVar278,auVar283._0_32_);
                auVar59._8_4_ = 0x3f3504f3;
                auVar59._0_8_ = 0x3f3504f33f3504f3;
                auVar59._12_4_ = 0x3f3504f3;
                auVar59._16_4_ = 0x3f3504f3;
                auVar59._20_4_ = 0x3f3504f3;
                auVar59._24_4_ = 0x3f3504f3;
                auVar59._28_4_ = 0x3f3504f3;
                auVar85 = vcmpps_avx(auVar59,auVar135,2);
                auVar278 = vandnps_avx(auVar85,auVar135);
                fVar257 = auVar135._0_4_ + -1.0 + auVar278._0_4_;
                fVar258 = auVar135._4_4_ + -1.0 + auVar278._4_4_;
                fVar259 = auVar135._8_4_ + -1.0 + auVar278._8_4_;
                fVar260 = auVar135._12_4_ + -1.0 + auVar278._12_4_;
                fVar261 = auVar135._16_4_ + -1.0 + auVar278._16_4_;
                fVar262 = auVar135._20_4_ + -1.0 + auVar278._20_4_;
                fVar307 = auVar135._24_4_ + -1.0 + auVar278._24_4_;
                auVar145 = vpsubd_avx(auVar145,auVar85._16_16_);
                auVar217 = vpsrld_avx(auVar56._0_16_,0x17);
                auVar51._8_4_ = 0xffffff81;
                auVar51._0_8_ = 0xffffff81ffffff81;
                auVar51._12_4_ = 0xffffff81;
                auVar145 = vpaddd_avx(auVar145,auVar51);
                auVar217 = vpsubd_avx(auVar217,auVar85._0_16_);
                auVar217 = vpaddd_avx(auVar217,auVar51);
                auVar136._16_16_ = auVar145;
                auVar136._0_16_ = auVar217;
                auVar92 = ZEXT864(0) << 0x20;
                auVar85 = vcmpps_avx(auVar248,ZEXT832(0) << 0x20,2);
                auVar56 = vcvtdq2ps_avx(auVar136);
                auVar15._4_4_ =
                     (fVar258 + auVar56._4_4_ * 0.6931472 +
                     fVar258 * fVar258 *
                     (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (
                                                  fVar258 * (fVar258 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._0_4_ =
                     (fVar257 + auVar56._0_4_ * 0.6931472 +
                     fVar257 * fVar257 *
                     (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (
                                                  fVar257 * (fVar257 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._8_4_ =
                     (fVar259 + auVar56._8_4_ * 0.6931472 +
                     fVar259 * fVar259 *
                     (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (
                                                  fVar259 * (fVar259 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._12_4_ =
                     (fVar260 + auVar56._12_4_ * 0.6931472 +
                     fVar260 * fVar260 *
                     (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (
                                                  fVar260 * (fVar260 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._16_4_ =
                     (fVar261 + auVar56._16_4_ * 0.6931472 +
                     fVar261 * fVar261 *
                     (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (
                                                  fVar261 * (fVar261 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._20_4_ =
                     (fVar262 + auVar56._20_4_ * 0.6931472 +
                     fVar262 * fVar262 *
                     (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (
                                                  fVar262 * (fVar262 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._24_4_ =
                     (fVar307 + auVar56._24_4_ * 0.6931472 +
                     fVar307 * fVar307 *
                     (fVar307 * (fVar307 * (fVar307 * (fVar307 * (fVar307 * (fVar307 * (fVar307 * (
                                                  fVar307 * (fVar307 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._28_4_ = auVar135._28_4_ + -1.0 + auVar278._28_4_ + auVar56._28_4_ + 0.0;
                auVar182._8_4_ = 0x7fffffff;
                auVar182._0_8_ = 0x7fffffff7fffffff;
                auVar182._12_4_ = 0x7fffffff;
                auVar182._16_4_ = 0x7fffffff;
                auVar182._20_4_ = 0x7fffffff;
                auVar182._24_4_ = 0x7fffffff;
                auVar182._28_4_ = 0x7fffffff;
                auVar278 = vblendvps_avx(auVar15,auVar182,auVar85);
                auVar278 = vminps_avx(auVar268,auVar278);
                auVar85 = vmaxps_avx(auVar271,auVar278);
                auVar183._0_4_ = auVar85._0_4_ * 1.442695 + fVar144;
                auVar183._4_4_ = auVar85._4_4_ * 1.442695 + fVar191;
                auVar183._8_4_ = auVar85._8_4_ * 1.442695 + fVar192;
                auVar183._12_4_ = auVar85._12_4_ * 1.442695 + fVar193;
                auVar183._16_4_ = auVar85._16_4_ * 1.442695 + fVar194;
                auVar183._20_4_ = auVar85._20_4_ * 1.442695 + fVar195;
                auVar183._24_4_ = auVar85._24_4_ * 1.442695 + fVar197;
                auVar183._28_4_ = fVar302 + NAN;
                auVar56 = vroundps_avx(auVar183,1);
                auVar278 = vcmpps_avx(auVar183,auVar56,1);
                auVar278 = vandps_avx(auVar278,auVar215);
                auVar278 = vsubps_avx(auVar56,auVar278);
                auVar16._4_4_ = auVar278._4_4_ * 0.6931472;
                auVar16._0_4_ = auVar278._0_4_ * 0.6931472;
                auVar16._8_4_ = auVar278._8_4_ * 0.6931472;
                auVar16._12_4_ = auVar278._12_4_ * 0.6931472;
                auVar16._16_4_ = auVar278._16_4_ * 0.6931472;
                auVar16._20_4_ = auVar278._20_4_ * 0.6931472;
                auVar16._24_4_ = auVar278._24_4_ * 0.6931472;
                auVar16._28_4_ = auVar56._28_4_;
                auVar85 = vsubps_avx(auVar85,auVar16);
                fVar257 = auVar85._0_4_;
                fVar258 = auVar85._4_4_;
                fVar259 = auVar85._8_4_;
                fVar260 = auVar85._12_4_;
                fVar261 = auVar85._16_4_;
                fVar262 = auVar85._20_4_;
                fVar307 = auVar85._24_4_;
                auVar273 = ZEXT3264(auVar215);
                auVar283 = ZEXT3264(auVar283._0_32_);
                fVar144 = fVar144 + ((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 +
                                      0.008333452) * fVar257 + 0.041665796) * fVar257 + 0.16666666)
                                    * fVar257;
                fVar191 = fVar191 + ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 +
                                      0.008333452) * fVar258 + 0.041665796) * fVar258 + 0.16666666)
                                    * fVar258;
                fVar192 = fVar192 + ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 +
                                      0.008333452) * fVar259 + 0.041665796) * fVar259 + 0.16666666)
                                    * fVar259;
                fVar193 = fVar193 + ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 +
                                      0.008333452) * fVar260 + 0.041665796) * fVar260 + 0.16666666)
                                    * fVar260;
                fVar194 = fVar194 + ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 +
                                      0.008333452) * fVar261 + 0.041665796) * fVar261 + 0.16666666)
                                    * fVar261;
                fVar195 = fVar195 + ((((fVar262 * 0.00019875691 + 0.0013981999) * fVar262 +
                                      0.008333452) * fVar262 + 0.041665796) * fVar262 + 0.16666666)
                                    * fVar262;
                fVar197 = fVar197 + ((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 +
                                      0.008333452) * fVar307 + 0.041665796) * fVar307 + 0.16666666)
                                    * fVar307;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar302 + auVar248._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar197,CONCAT420(fVar195,CONCAT416(fVar194,
                                                  CONCAT412(fVar193,CONCAT48(fVar192,CONCAT44(
                                                  fVar191,fVar144))))))));
                auVar147._0_4_ = (int)auVar278._0_4_;
                auVar147._4_4_ = (int)auVar278._4_4_;
                auVar147._8_4_ = (int)auVar278._8_4_;
                auVar147._12_4_ = (int)auVar278._12_4_;
                auVar184._16_4_ = (int)auVar278._16_4_;
                auVar184._0_16_ = auVar147;
                auVar184._20_4_ = (int)auVar278._20_4_;
                auVar184._24_4_ = (int)auVar278._24_4_;
                auVar184._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar147,0x17);
                auVar145 = vpslld_avx(auVar184._16_16_,0x17);
                auVar64._8_4_ = 0x3f800000;
                auVar64._0_8_ = 0x3f8000003f800000;
                auVar64._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar64);
                auVar217 = vpaddd_avx(auVar217,auVar64);
                auVar137._0_4_ =
                     (fVar257 + fVar49 + fVar257 * fVar257 * fVar144) * auVar217._0_4_ + fVar49;
                auVar137._4_4_ =
                     (fVar258 + fVar63 + fVar258 * fVar258 * fVar191) * auVar217._4_4_ + fVar63;
                auVar137._8_4_ =
                     (fVar259 + fVar93 + fVar259 * fVar259 * fVar192) * auVar217._8_4_ + fVar93;
                auVar137._12_4_ =
                     (fVar260 + fVar94 + fVar260 * fVar260 * fVar193) * auVar217._12_4_ + fVar94;
                auVar137._16_4_ =
                     (fVar261 + fVar199 + fVar261 * fVar261 * fVar194) * auVar145._0_4_ + fVar199;
                auVar137._20_4_ =
                     (fVar262 + fVar95 + fVar262 * fVar262 * fVar195) * auVar145._4_4_ + fVar95;
                auVar137._24_4_ =
                     (fVar307 + fVar196 + fVar307 * fVar307 * fVar197) * auVar145._8_4_ + fVar196;
                auVar137._28_4_ = auVar85._28_4_ + fVar198 + auVar56._28_4_ + fVar198;
                auVar215 = vrcpps_avx(auVar137);
                fVar49 = auVar215._0_4_;
                fVar63 = auVar215._4_4_;
                fVar93 = auVar215._8_4_;
                fVar94 = auVar215._12_4_;
                fVar199 = auVar215._16_4_;
                fVar95 = auVar215._20_4_;
                fVar196 = auVar215._24_4_;
                auVar17._4_4_ = auVar137._4_4_ * (fVar63 + fVar63);
                auVar17._0_4_ = auVar137._0_4_ * (fVar49 + fVar49);
                auVar17._8_4_ = auVar137._8_4_ * (fVar93 + fVar93);
                auVar17._12_4_ = auVar137._12_4_ * (fVar94 + fVar94);
                auVar17._16_4_ = auVar137._16_4_ * (fVar199 + fVar199);
                auVar17._20_4_ = auVar137._20_4_ * (fVar95 + fVar95);
                auVar17._24_4_ = auVar137._24_4_ * (fVar196 + fVar196);
                auVar17._28_4_ = auVar137._28_4_;
                auVar86._8_4_ = 0x40000000;
                auVar86._0_8_ = 0x4000000040000000;
                auVar86._12_4_ = 0x40000000;
                auVar86._16_4_ = 0x40000000;
                auVar86._20_4_ = 0x40000000;
                auVar86._24_4_ = 0x40000000;
                auVar86._28_4_ = 0x40000000;
                auVar278 = vsubps_avx(auVar86,auVar17);
                auVar185._0_4_ = fVar49 + fVar49 + -1.0;
                auVar185._4_4_ = fVar63 + fVar63 + -1.0;
                auVar185._8_4_ = fVar93 + fVar93 + -1.0;
                auVar185._12_4_ = fVar94 + fVar94 + -1.0;
                auVar185._16_4_ = fVar199 + fVar199 + -1.0;
                auVar185._20_4_ = fVar95 + fVar95 + -1.0;
                auVar185._24_4_ = fVar196 + fVar196 + -1.0;
                auVar185._28_4_ = auVar215._28_4_ + auVar215._28_4_ + -1.0;
                auVar127._0_4_ = auVar185._0_4_ + fVar49 * auVar278._0_4_;
                auVar127._4_4_ = auVar185._4_4_ + fVar63 * auVar278._4_4_;
                auVar127._8_4_ = auVar185._8_4_ + fVar93 * auVar278._8_4_;
                auVar127._12_4_ = auVar185._12_4_ + fVar94 * auVar278._12_4_;
                auVar127._16_4_ = auVar185._16_4_ + fVar199 * auVar278._16_4_;
                auVar127._20_4_ = auVar185._20_4_ + fVar95 * auVar278._20_4_;
                auVar127._24_4_ = auVar185._24_4_ + fVar196 * auVar278._24_4_;
                goto LAB_004fbbfe;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar185._4_4_ = fVar63;
                auVar185._0_4_ = fVar63;
                auVar185._8_4_ = fVar63;
                auVar185._12_4_ = fVar63;
                auVar185._16_4_ = fVar63;
                auVar185._20_4_ = fVar63;
                auVar185._24_4_ = fVar63;
                auVar185._28_4_ = fVar63;
                auVar139._0_4_ = auVar284._0_4_ * fVar49 + fVar63;
                auVar139._4_4_ = auVar284._4_4_ * fVar49 + fVar63;
                auVar139._8_4_ = fVar303 * fVar49 + fVar63;
                auVar139._12_4_ = fVar304 * fVar49 + fVar63;
                auVar139._16_4_ = fVar305 * fVar49 + fVar63;
                auVar139._20_4_ = fVar306 * fVar49 + fVar63;
                auVar139._24_4_ = fVar216 * fVar49 + fVar63;
                auVar139._28_4_ = fVar49 + fVar63;
                auVar278 = vmaxps_avx(auVar139,auVar92._0_32_);
                auVar215 = vminps_avx(auVar278,auVar215);
                auVar127 = auVar215._0_28_;
LAB_004fbbfe:
                in_ZMM3 = ZEXT3264(auVar185);
                auVar285._0_4_ = auVar284._0_4_ * auVar127._0_4_;
                auVar285._4_4_ = auVar284._4_4_ * auVar127._4_4_;
                auVar285._8_4_ = fVar303 * auVar127._8_4_;
                auVar285._12_4_ = fVar304 * auVar127._12_4_;
                auVar285._16_4_ = fVar305 * auVar127._16_4_;
                auVar285._20_4_ = fVar306 * auVar127._20_4_;
                auVar285._24_4_ = fVar216 * auVar127._24_4_;
                auVar280 = auVar285._0_32_;
              }
              *pauVar34 = auVar280;
              pauVar34 = pauVar34 + 1;
              bVar45 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar45);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar27);
      }
      if ((bVar46 && bVar44) && iVar2 == 4) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar283 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar273 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar269._8_4_ = 0x42b0c0a5;
        auVar269._0_8_ = 0x42b0c0a542b0c0a5;
        auVar269._12_4_ = 0x42b0c0a5;
        auVar269._16_4_ = 0x42b0c0a5;
        auVar269._20_4_ = 0x42b0c0a5;
        auVar269._24_4_ = 0x42b0c0a5;
        auVar269._28_4_ = 0x42b0c0a5;
        auVar272._8_4_ = 0xc2b0c0a5;
        auVar272._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar272._12_4_ = 0xc2b0c0a5;
        auVar272._16_4_ = 0xc2b0c0a5;
        auVar272._20_4_ = 0xc2b0c0a5;
        auVar272._24_4_ = 0xc2b0c0a5;
        auVar272._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar284 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar284 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_110 * 0x20));
              }
              if (0 < iVar26) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4
                                     + 4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-3];
                      fVar63 = pfVar31[-2];
                      fVar93 = pfVar31[-1];
                      fVar94 = *pfVar31;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar94,CONCAT424(fVar94,CONCAT420(fVar94,
                                                  CONCAT416(fVar94,CONCAT412(fVar94,CONCAT48(fVar94,
                                                  CONCAT44(fVar94,fVar94))))))));
                      fVar199 = fVar63 + fVar93;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar199,CONCAT424(fVar94 * pfVar43[0x1e],
                                                                     CONCAT420(fVar94 * pfVar43[0x1d
                                                  ],CONCAT416(fVar94 * pfVar43[0x1c],
                                                              CONCAT412(fVar94 * pfVar43[0x1b],
                                                                        CONCAT48(fVar94 * pfVar43[
                                                  0x1a],CONCAT44(fVar94 * pfVar43[0x19],
                                                                 fVar94 * pfVar43[0x18]))))))));
                      auVar284 = ZEXT3264(CONCAT428(auVar284._28_4_ + fVar49 + fVar199 + fVar199,
                                                    CONCAT424(auVar284._24_4_ + fVar49 * pfVar43[6]
                                                              + fVar63 * pfVar43[0xe] +
                                                                fVar93 * pfVar43[0x16] +
                                                              fVar94 * pfVar43[0x1e],
                                                              CONCAT420(auVar284._20_4_ +
                                                                        fVar49 * pfVar43[5] +
                                                                        fVar63 * pfVar43[0xd] +
                                                                        fVar93 * pfVar43[0x15] +
                                                                        fVar94 * pfVar43[0x1d],
                                                                        CONCAT416(auVar284._16_4_ +
                                                                                  fVar49 * pfVar43[4
                                                  ] + fVar63 * pfVar43[0xc] + fVar93 * pfVar43[0x14]
                                                  + fVar94 * pfVar43[0x1c],
                                                  CONCAT412(auVar284._12_4_ + fVar49 * pfVar43[3] +
                                                            fVar63 * pfVar43[0xb] +
                                                            fVar93 * pfVar43[0x13] +
                                                            fVar94 * pfVar43[0x1b],
                                                            CONCAT48(auVar284._8_4_ +
                                                                     fVar49 * pfVar43[2] +
                                                                     fVar63 * pfVar43[10] +
                                                                     fVar93 * pfVar43[0x12] +
                                                                     fVar94 * pfVar43[0x1a],
                                                                     CONCAT44(auVar284._4_4_ +
                                                                              fVar49 * pfVar43[1] +
                                                                              fVar63 * pfVar43[9] +
                                                                              fVar93 * pfVar43[0x11]
                                                                              + fVar94 * pfVar43[
                                                  0x19],auVar284._0_4_ + fVar49 * *pfVar43 +
                                                        fVar63 * pfVar43[8] + fVar93 * pfVar43[0x10]
                                                        + fVar94 * pfVar43[0x18]))))))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  uVar37 = uVar37 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar37 != uVar41);
              }
              auVar282 = auVar284._0_32_;
              fVar303 = auVar284._8_4_;
              fVar304 = auVar284._12_4_;
              fVar305 = auVar284._16_4_;
              fVar306 = auVar284._20_4_;
              fVar216 = auVar284._24_4_;
              fVar144 = auVar283._0_4_;
              fVar191 = auVar283._4_4_;
              fVar192 = auVar283._8_4_;
              fVar193 = auVar283._12_4_;
              fVar194 = auVar283._16_4_;
              fVar195 = auVar283._20_4_;
              fVar197 = auVar283._24_4_;
              fVar302 = auVar283._28_4_;
              auVar215 = auVar273._0_32_;
              fVar49 = auVar273._0_4_;
              fVar63 = auVar273._4_4_;
              fVar93 = auVar273._8_4_;
              fVar94 = auVar273._12_4_;
              fVar199 = auVar273._16_4_;
              fVar95 = auVar273._20_4_;
              fVar196 = auVar273._24_4_;
              fVar198 = auVar273._28_4_;
              auVar286._28_36_ = auVar284._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar282 = vmaxps_avx(auVar282,auVar92._0_32_);
                break;
              case 2:
                auVar215 = vmaxps_avx(auVar282,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar215);
                auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar278 = vminps_avx(auVar282,ZEXT1632(ZEXT816(0) << 0x40));
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar282._0_4_ = fVar49 * auVar278._0_4_ + auVar215._0_4_;
                auVar282._4_4_ = fVar49 * auVar278._4_4_ + auVar215._4_4_;
                auVar282._8_4_ = fVar49 * auVar278._8_4_ + auVar215._8_4_;
                auVar282._12_4_ = fVar49 * auVar278._12_4_ + auVar215._12_4_;
                auVar282._16_4_ = fVar49 * auVar278._16_4_ + auVar215._16_4_;
                auVar282._20_4_ = fVar49 * auVar278._20_4_ + auVar215._20_4_;
                auVar282._24_4_ = fVar49 * auVar278._24_4_ + auVar215._24_4_;
                auVar282._28_4_ = auVar278._28_4_ + auVar215._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar254._4_4_ = uVar1;
                auVar254._0_4_ = uVar1;
                auVar254._8_4_ = uVar1;
                auVar254._12_4_ = uVar1;
                auVar254._16_4_ = uVar1;
                auVar254._20_4_ = uVar1;
                auVar254._24_4_ = uVar1;
                auVar254._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar301._4_4_ = uVar1;
                auVar301._0_4_ = uVar1;
                auVar301._8_4_ = uVar1;
                auVar301._12_4_ = uVar1;
                auVar301._16_4_ = uVar1;
                auVar301._20_4_ = uVar1;
                auVar301._24_4_ = uVar1;
                auVar301._28_4_ = uVar1;
                auVar215 = vmaxps_avx(auVar282,auVar254);
                in_ZMM7 = ZEXT3264(auVar215);
                auVar282 = vminps_avx(auVar301,auVar215);
                break;
              case 4:
                auVar255._0_8_ = auVar284._0_8_ ^ 0x8000000080000000;
                auVar255._8_4_ = -fVar303;
                auVar255._12_4_ = -fVar304;
                auVar255._16_4_ = -fVar305;
                auVar255._20_4_ = -fVar306;
                auVar255._24_4_ = -fVar216;
                auVar255._28_4_ = -auVar284._28_4_;
                auVar90._8_4_ = 0x42b0c0a5;
                auVar90._0_8_ = 0x42b0c0a542b0c0a5;
                auVar90._12_4_ = 0x42b0c0a5;
                auVar90._16_4_ = 0x42b0c0a5;
                auVar90._20_4_ = 0x42b0c0a5;
                auVar90._24_4_ = 0x42b0c0a5;
                auVar90._28_4_ = 0x42b0c0a5;
                auVar278 = vminps_avx(auVar255,auVar90);
                auVar91._8_4_ = 0xc2b0c0a5;
                auVar91._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar91._12_4_ = 0xc2b0c0a5;
                auVar91._16_4_ = 0xc2b0c0a5;
                auVar91._20_4_ = 0xc2b0c0a5;
                auVar91._24_4_ = 0xc2b0c0a5;
                auVar91._28_4_ = 0xc2b0c0a5;
                auVar85 = vmaxps_avx(auVar278,auVar91);
                auVar281._0_4_ = auVar85._0_4_ * 1.442695 + fVar144;
                auVar281._4_4_ = auVar85._4_4_ * 1.442695 + fVar191;
                auVar281._8_4_ = auVar85._8_4_ * 1.442695 + fVar192;
                auVar281._12_4_ = auVar85._12_4_ * 1.442695 + fVar193;
                auVar281._16_4_ = auVar85._16_4_ * 1.442695 + fVar194;
                auVar281._20_4_ = auVar85._20_4_ * 1.442695 + fVar195;
                auVar281._24_4_ = auVar85._24_4_ * 1.442695 + fVar197;
                auVar281._28_4_ = auVar284._28_4_ + fVar302;
                auVar56 = vroundps_avx(auVar281,1);
                auVar278 = vcmpps_avx(auVar281,auVar56,1);
                auVar278 = vandps_avx(auVar278,auVar215);
                auVar278 = vsubps_avx(auVar56,auVar278);
                fVar303 = auVar278._0_4_ * -0.6931472 + auVar85._0_4_;
                fVar304 = auVar278._4_4_ * -0.6931472 + auVar85._4_4_;
                fVar305 = auVar278._8_4_ * -0.6931472 + auVar85._8_4_;
                fVar306 = auVar278._12_4_ * -0.6931472 + auVar85._12_4_;
                fVar216 = auVar278._16_4_ * -0.6931472 + auVar85._16_4_;
                fVar257 = auVar278._20_4_ * -0.6931472 + auVar85._20_4_;
                fVar258 = auVar278._24_4_ * -0.6931472 + auVar85._24_4_;
                auVar220._0_4_ = (int)auVar278._0_4_;
                auVar220._4_4_ = (int)auVar278._4_4_;
                auVar220._8_4_ = (int)auVar278._8_4_;
                auVar220._12_4_ = (int)auVar278._12_4_;
                auVar256._16_4_ = (int)auVar278._16_4_;
                auVar256._0_16_ = auVar220;
                auVar256._20_4_ = (int)auVar278._20_4_;
                auVar256._24_4_ = (int)auVar278._24_4_;
                auVar256._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar220,0x17);
                auVar145 = vpslld_avx(auVar256._16_16_,0x17);
                auVar67._8_4_ = 0x3f800000;
                auVar67._0_8_ = 0x3f8000003f800000;
                auVar67._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar67);
                auVar217 = vpaddd_avx(auVar217,auVar67);
                auVar142._0_4_ =
                     (fVar303 + fVar49 +
                     fVar303 * fVar303 *
                     (fVar144 +
                     ((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) * fVar303
                      + 0.041665796) * fVar303 + 0.16666666) * fVar303)) * auVar217._0_4_ + fVar49;
                auVar142._4_4_ =
                     (fVar304 + fVar63 +
                     fVar304 * fVar304 *
                     (fVar191 +
                     ((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) * fVar304
                      + 0.041665796) * fVar304 + 0.16666666) * fVar304)) * auVar217._4_4_ + fVar63;
                auVar142._8_4_ =
                     (fVar305 + fVar93 +
                     fVar305 * fVar305 *
                     (fVar192 +
                     ((((fVar305 * 0.00019875691 + 0.0013981999) * fVar305 + 0.008333452) * fVar305
                      + 0.041665796) * fVar305 + 0.16666666) * fVar305)) * auVar217._8_4_ + fVar93;
                auVar142._12_4_ =
                     (fVar306 + fVar94 +
                     fVar306 * fVar306 *
                     (fVar193 +
                     ((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) * fVar306
                      + 0.041665796) * fVar306 + 0.16666666) * fVar306)) * auVar217._12_4_ + fVar94;
                auVar142._16_4_ =
                     (fVar216 + fVar199 +
                     fVar216 * fVar216 *
                     (fVar194 +
                     ((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216
                      + 0.041665796) * fVar216 + 0.16666666) * fVar216)) * auVar145._0_4_ + fVar199;
                auVar142._20_4_ =
                     (fVar257 + fVar95 +
                     fVar257 * fVar257 *
                     (fVar195 +
                     ((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257
                      + 0.041665796) * fVar257 + 0.16666666) * fVar257)) * auVar145._4_4_ + fVar95;
                auVar142._24_4_ =
                     (fVar258 + fVar196 +
                     fVar258 * fVar258 *
                     (fVar197 +
                     ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258
                      + 0.041665796) * fVar258 + 0.16666666) * fVar258)) * auVar145._8_4_ + fVar196;
                auVar142._28_4_ =
                     auVar56._28_4_ + auVar85._28_4_ + fVar198 + fVar302 + -0.47508308 + fVar198;
                auVar278 = vrcpps_avx(auVar142);
                in_ZMM7 = ZEXT3264(auVar278);
                fVar49 = auVar278._0_4_;
                fVar63 = auVar278._4_4_;
                auVar23._4_4_ = auVar142._4_4_ * fVar63;
                auVar23._0_4_ = auVar142._0_4_ * fVar49;
                fVar93 = auVar278._8_4_;
                auVar23._8_4_ = auVar142._8_4_ * fVar93;
                fVar94 = auVar278._12_4_;
                auVar23._12_4_ = auVar142._12_4_ * fVar94;
                fVar199 = auVar278._16_4_;
                auVar23._16_4_ = auVar142._16_4_ * fVar199;
                fVar95 = auVar278._20_4_;
                auVar23._20_4_ = auVar142._20_4_ * fVar95;
                fVar196 = auVar278._24_4_;
                auVar23._24_4_ = auVar142._24_4_ * fVar196;
                auVar23._28_4_ = auVar142._28_4_;
                auVar215 = vsubps_avx(auVar215,auVar23);
                auVar282._0_4_ = fVar49 + fVar49 * auVar215._0_4_;
                auVar282._4_4_ = fVar63 + fVar63 * auVar215._4_4_;
                auVar282._8_4_ = fVar93 + fVar93 * auVar215._8_4_;
                auVar282._12_4_ = fVar94 + fVar94 * auVar215._12_4_;
                auVar282._16_4_ = fVar199 + fVar199 * auVar215._16_4_;
                auVar282._20_4_ = fVar95 + fVar95 * auVar215._20_4_;
                auVar282._24_4_ = fVar196 + fVar196 * auVar215._24_4_;
                auVar282._28_4_ = auVar278._28_4_ + auVar215._28_4_;
                break;
              case 5:
                auVar278 = vminps_avx(auVar282,auVar269);
                auVar85 = vmaxps_avx(auVar272,auVar278);
                auVar252._0_4_ = fVar144 + auVar85._0_4_ * 1.442695;
                auVar252._4_4_ = fVar191 + auVar85._4_4_ * 1.442695;
                auVar252._8_4_ = fVar192 + auVar85._8_4_ * 1.442695;
                auVar252._12_4_ = fVar193 + auVar85._12_4_ * 1.442695;
                auVar252._16_4_ = fVar194 + auVar85._16_4_ * 1.442695;
                auVar252._20_4_ = fVar195 + auVar85._20_4_ * 1.442695;
                auVar252._24_4_ = fVar197 + auVar85._24_4_ * 1.442695;
                auVar252._28_4_ = fVar302 + in_ZMM7._28_4_;
                auVar56 = vroundps_avx(auVar252,1);
                auVar278 = vcmpps_avx(auVar252,auVar56,1);
                auVar278 = vandps_avx(auVar278,auVar215);
                auVar278 = vsubps_avx(auVar56,auVar278);
                auVar19._4_4_ = auVar278._4_4_ * 0.6931472;
                auVar19._0_4_ = auVar278._0_4_ * 0.6931472;
                auVar19._8_4_ = auVar278._8_4_ * 0.6931472;
                auVar19._12_4_ = auVar278._12_4_ * 0.6931472;
                auVar19._16_4_ = auVar278._16_4_ * 0.6931472;
                auVar19._20_4_ = auVar278._20_4_ * 0.6931472;
                auVar19._24_4_ = auVar278._24_4_ * 0.6931472;
                auVar19._28_4_ = auVar56._28_4_;
                auVar85 = vsubps_avx(auVar85,auVar19);
                fVar257 = auVar85._0_4_;
                fVar258 = auVar85._4_4_;
                fVar259 = auVar85._8_4_;
                fVar260 = auVar85._12_4_;
                fVar261 = auVar85._16_4_;
                fVar262 = auVar85._20_4_;
                fVar307 = auVar85._24_4_;
                auVar148._0_4_ = (int)auVar278._0_4_;
                auVar148._4_4_ = (int)auVar278._4_4_;
                auVar148._8_4_ = (int)auVar278._8_4_;
                auVar148._12_4_ = (int)auVar278._12_4_;
                auVar186._16_4_ = (int)auVar278._16_4_;
                auVar186._0_16_ = auVar148;
                auVar186._20_4_ = (int)auVar278._20_4_;
                auVar186._24_4_ = (int)auVar278._24_4_;
                auVar186._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar148,0x17);
                auVar145 = vpslld_avx(auVar186._16_16_,0x17);
                auVar210._8_4_ = 0x3f800000;
                auVar210._0_8_ = 0x3f8000003f800000;
                auVar210._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar210);
                auVar217 = vpaddd_avx(auVar217,auVar210);
                auVar253._0_4_ =
                     (fVar257 + fVar49 +
                     fVar257 * fVar257 *
                     (((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 + 0.008333452) * fVar257
                       + 0.041665796) * fVar257 + 0.16666666) * fVar257 + fVar144)) * auVar217._0_4_
                     + fVar49;
                auVar253._4_4_ =
                     (fVar258 + fVar63 +
                     fVar258 * fVar258 *
                     (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258
                       + 0.041665796) * fVar258 + 0.16666666) * fVar258 + fVar191)) * auVar217._4_4_
                     + fVar63;
                auVar253._8_4_ =
                     (fVar259 + fVar93 +
                     fVar259 * fVar259 *
                     (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259
                       + 0.041665796) * fVar259 + 0.16666666) * fVar259 + fVar192)) * auVar217._8_4_
                     + fVar93;
                auVar253._12_4_ =
                     (fVar260 + fVar94 +
                     fVar260 * fVar260 *
                     (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260
                       + 0.041665796) * fVar260 + 0.16666666) * fVar260 + fVar193)) *
                     auVar217._12_4_ + fVar94;
                auVar253._16_4_ =
                     (fVar261 + fVar199 +
                     fVar261 * fVar261 *
                     (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261
                       + 0.041665796) * fVar261 + 0.16666666) * fVar261 + fVar194)) * auVar145._0_4_
                     + fVar199;
                auVar253._20_4_ =
                     (fVar262 + fVar95 +
                     fVar262 * fVar262 *
                     (((((fVar262 * 0.00019875691 + 0.0013981999) * fVar262 + 0.008333452) * fVar262
                       + 0.041665796) * fVar262 + 0.16666666) * fVar262 + fVar195)) * auVar145._4_4_
                     + fVar95;
                auVar253._24_4_ =
                     (fVar307 + fVar196 +
                     fVar307 * fVar307 *
                     (((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307
                       + 0.041665796) * fVar307 + 0.16666666) * fVar307 + fVar197)) * auVar145._8_4_
                     + fVar196;
                auVar253._28_4_ =
                     auVar85._28_4_ + fVar198 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar302 + fVar198;
                auVar60._8_4_ = 0x800000;
                auVar60._0_8_ = 0x80000000800000;
                auVar60._12_4_ = 0x800000;
                auVar60._16_4_ = 0x800000;
                auVar60._20_4_ = 0x800000;
                auVar60._24_4_ = 0x800000;
                auVar60._28_4_ = 0x800000;
                auVar56 = vmaxps_avx(auVar253,auVar60);
                auVar145 = vpsrld_avx(auVar56._16_16_,0x17);
                auVar61._8_4_ = 0x807fffff;
                auVar61._0_8_ = 0x807fffff807fffff;
                auVar61._12_4_ = 0x807fffff;
                auVar61._16_4_ = 0x807fffff;
                auVar61._20_4_ = 0x807fffff;
                auVar61._24_4_ = 0x807fffff;
                auVar61._28_4_ = 0x807fffff;
                auVar278 = vandps_avx(auVar56,auVar61);
                auVar135 = vorps_avx(auVar278,auVar283._0_32_);
                auVar62._8_4_ = 0x3f3504f3;
                auVar62._0_8_ = 0x3f3504f33f3504f3;
                auVar62._12_4_ = 0x3f3504f3;
                auVar62._16_4_ = 0x3f3504f3;
                auVar62._20_4_ = 0x3f3504f3;
                auVar62._24_4_ = 0x3f3504f3;
                auVar62._28_4_ = 0x3f3504f3;
                auVar85 = vcmpps_avx(auVar62,auVar135,2);
                auVar278 = vandnps_avx(auVar85,auVar135);
                fVar257 = auVar135._0_4_ + -1.0 + auVar278._0_4_;
                fVar258 = auVar135._4_4_ + -1.0 + auVar278._4_4_;
                fVar259 = auVar135._8_4_ + -1.0 + auVar278._8_4_;
                fVar260 = auVar135._12_4_ + -1.0 + auVar278._12_4_;
                fVar261 = auVar135._16_4_ + -1.0 + auVar278._16_4_;
                fVar262 = auVar135._20_4_ + -1.0 + auVar278._20_4_;
                fVar307 = auVar135._24_4_ + -1.0 + auVar278._24_4_;
                auVar145 = vpsubd_avx(auVar145,auVar85._16_16_);
                auVar217 = vpsrld_avx(auVar56._0_16_,0x17);
                auVar52._8_4_ = 0xffffff81;
                auVar52._0_8_ = 0xffffff81ffffff81;
                auVar52._12_4_ = 0xffffff81;
                auVar145 = vpaddd_avx(auVar145,auVar52);
                auVar217 = vpsubd_avx(auVar217,auVar85._0_16_);
                auVar217 = vpaddd_avx(auVar217,auVar52);
                auVar140._16_16_ = auVar145;
                auVar140._0_16_ = auVar217;
                auVar92 = ZEXT864(0) << 0x20;
                auVar85 = vcmpps_avx(auVar253,ZEXT832(0) << 0x20,2);
                auVar56 = vcvtdq2ps_avx(auVar140);
                auVar20._4_4_ =
                     (fVar258 + auVar56._4_4_ * 0.6931472 +
                     fVar258 * fVar258 *
                     (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (fVar258 * (
                                                  fVar258 * (fVar258 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar20._0_4_ =
                     (fVar257 + auVar56._0_4_ * 0.6931472 +
                     fVar257 * fVar257 *
                     (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (fVar257 * (
                                                  fVar257 * (fVar257 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar20._8_4_ =
                     (fVar259 + auVar56._8_4_ * 0.6931472 +
                     fVar259 * fVar259 *
                     (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (fVar259 * (
                                                  fVar259 * (fVar259 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar20._12_4_ =
                     (fVar260 + auVar56._12_4_ * 0.6931472 +
                     fVar260 * fVar260 *
                     (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (fVar260 * (
                                                  fVar260 * (fVar260 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar20._16_4_ =
                     (fVar261 + auVar56._16_4_ * 0.6931472 +
                     fVar261 * fVar261 *
                     (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (fVar261 * (
                                                  fVar261 * (fVar261 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar20._20_4_ =
                     (fVar262 + auVar56._20_4_ * 0.6931472 +
                     fVar262 * fVar262 *
                     (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (fVar262 * (
                                                  fVar262 * (fVar262 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar20._24_4_ =
                     (fVar307 + auVar56._24_4_ * 0.6931472 +
                     fVar307 * fVar307 *
                     (fVar307 * (fVar307 * (fVar307 * (fVar307 * (fVar307 * (fVar307 * (fVar307 * (
                                                  fVar307 * (fVar307 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar20._28_4_ = auVar135._28_4_ + -1.0 + auVar278._28_4_ + auVar56._28_4_ + 0.0;
                auVar187._8_4_ = 0x7fffffff;
                auVar187._0_8_ = 0x7fffffff7fffffff;
                auVar187._12_4_ = 0x7fffffff;
                auVar187._16_4_ = 0x7fffffff;
                auVar187._20_4_ = 0x7fffffff;
                auVar187._24_4_ = 0x7fffffff;
                auVar187._28_4_ = 0x7fffffff;
                auVar278 = vblendvps_avx(auVar20,auVar187,auVar85);
                auVar278 = vminps_avx(auVar269,auVar278);
                auVar85 = vmaxps_avx(auVar272,auVar278);
                auVar188._0_4_ = auVar85._0_4_ * 1.442695 + fVar144;
                auVar188._4_4_ = auVar85._4_4_ * 1.442695 + fVar191;
                auVar188._8_4_ = auVar85._8_4_ * 1.442695 + fVar192;
                auVar188._12_4_ = auVar85._12_4_ * 1.442695 + fVar193;
                auVar188._16_4_ = auVar85._16_4_ * 1.442695 + fVar194;
                auVar188._20_4_ = auVar85._20_4_ * 1.442695 + fVar195;
                auVar188._24_4_ = auVar85._24_4_ * 1.442695 + fVar197;
                auVar188._28_4_ = fVar302 + NAN;
                auVar56 = vroundps_avx(auVar188,1);
                auVar278 = vcmpps_avx(auVar188,auVar56,1);
                auVar278 = vandps_avx(auVar278,auVar215);
                auVar278 = vsubps_avx(auVar56,auVar278);
                auVar21._4_4_ = auVar278._4_4_ * 0.6931472;
                auVar21._0_4_ = auVar278._0_4_ * 0.6931472;
                auVar21._8_4_ = auVar278._8_4_ * 0.6931472;
                auVar21._12_4_ = auVar278._12_4_ * 0.6931472;
                auVar21._16_4_ = auVar278._16_4_ * 0.6931472;
                auVar21._20_4_ = auVar278._20_4_ * 0.6931472;
                auVar21._24_4_ = auVar278._24_4_ * 0.6931472;
                auVar21._28_4_ = auVar56._28_4_;
                auVar85 = vsubps_avx(auVar85,auVar21);
                fVar257 = auVar85._0_4_;
                fVar258 = auVar85._4_4_;
                fVar259 = auVar85._8_4_;
                fVar260 = auVar85._12_4_;
                fVar261 = auVar85._16_4_;
                fVar262 = auVar85._20_4_;
                fVar307 = auVar85._24_4_;
                auVar273 = ZEXT3264(auVar215);
                auVar283 = ZEXT3264(auVar283._0_32_);
                fVar144 = fVar144 + ((((fVar257 * 0.00019875691 + 0.0013981999) * fVar257 +
                                      0.008333452) * fVar257 + 0.041665796) * fVar257 + 0.16666666)
                                    * fVar257;
                fVar191 = fVar191 + ((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 +
                                      0.008333452) * fVar258 + 0.041665796) * fVar258 + 0.16666666)
                                    * fVar258;
                fVar192 = fVar192 + ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 +
                                      0.008333452) * fVar259 + 0.041665796) * fVar259 + 0.16666666)
                                    * fVar259;
                fVar193 = fVar193 + ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 +
                                      0.008333452) * fVar260 + 0.041665796) * fVar260 + 0.16666666)
                                    * fVar260;
                fVar194 = fVar194 + ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 +
                                      0.008333452) * fVar261 + 0.041665796) * fVar261 + 0.16666666)
                                    * fVar261;
                fVar195 = fVar195 + ((((fVar262 * 0.00019875691 + 0.0013981999) * fVar262 +
                                      0.008333452) * fVar262 + 0.041665796) * fVar262 + 0.16666666)
                                    * fVar262;
                fVar197 = fVar197 + ((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 +
                                      0.008333452) * fVar307 + 0.041665796) * fVar307 + 0.16666666)
                                    * fVar307;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar302 + auVar253._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar197,CONCAT420(fVar195,CONCAT416(fVar194,
                                                  CONCAT412(fVar193,CONCAT48(fVar192,CONCAT44(
                                                  fVar191,fVar144))))))));
                auVar149._0_4_ = (int)auVar278._0_4_;
                auVar149._4_4_ = (int)auVar278._4_4_;
                auVar149._8_4_ = (int)auVar278._8_4_;
                auVar149._12_4_ = (int)auVar278._12_4_;
                auVar189._16_4_ = (int)auVar278._16_4_;
                auVar189._0_16_ = auVar149;
                auVar189._20_4_ = (int)auVar278._20_4_;
                auVar189._24_4_ = (int)auVar278._24_4_;
                auVar189._28_4_ = (int)auVar278._28_4_;
                auVar217 = vpslld_avx(auVar149,0x17);
                auVar145 = vpslld_avx(auVar189._16_16_,0x17);
                auVar66._8_4_ = 0x3f800000;
                auVar66._0_8_ = 0x3f8000003f800000;
                auVar66._12_4_ = 0x3f800000;
                auVar145 = vpaddd_avx(auVar145,auVar66);
                auVar217 = vpaddd_avx(auVar217,auVar66);
                auVar141._0_4_ =
                     (fVar257 + fVar49 + fVar257 * fVar257 * fVar144) * auVar217._0_4_ + fVar49;
                auVar141._4_4_ =
                     (fVar258 + fVar63 + fVar258 * fVar258 * fVar191) * auVar217._4_4_ + fVar63;
                auVar141._8_4_ =
                     (fVar259 + fVar93 + fVar259 * fVar259 * fVar192) * auVar217._8_4_ + fVar93;
                auVar141._12_4_ =
                     (fVar260 + fVar94 + fVar260 * fVar260 * fVar193) * auVar217._12_4_ + fVar94;
                auVar141._16_4_ =
                     (fVar261 + fVar199 + fVar261 * fVar261 * fVar194) * auVar145._0_4_ + fVar199;
                auVar141._20_4_ =
                     (fVar262 + fVar95 + fVar262 * fVar262 * fVar195) * auVar145._4_4_ + fVar95;
                auVar141._24_4_ =
                     (fVar307 + fVar196 + fVar307 * fVar307 * fVar197) * auVar145._8_4_ + fVar196;
                auVar141._28_4_ = auVar85._28_4_ + fVar198 + auVar56._28_4_ + fVar198;
                auVar215 = vrcpps_avx(auVar141);
                fVar49 = auVar215._0_4_;
                fVar63 = auVar215._4_4_;
                fVar93 = auVar215._8_4_;
                fVar94 = auVar215._12_4_;
                fVar199 = auVar215._16_4_;
                fVar95 = auVar215._20_4_;
                fVar196 = auVar215._24_4_;
                auVar22._4_4_ = auVar141._4_4_ * (fVar63 + fVar63);
                auVar22._0_4_ = auVar141._0_4_ * (fVar49 + fVar49);
                auVar22._8_4_ = auVar141._8_4_ * (fVar93 + fVar93);
                auVar22._12_4_ = auVar141._12_4_ * (fVar94 + fVar94);
                auVar22._16_4_ = auVar141._16_4_ * (fVar199 + fVar199);
                auVar22._20_4_ = auVar141._20_4_ * (fVar95 + fVar95);
                auVar22._24_4_ = auVar141._24_4_ * (fVar196 + fVar196);
                auVar22._28_4_ = auVar141._28_4_;
                auVar89._8_4_ = 0x40000000;
                auVar89._0_8_ = 0x4000000040000000;
                auVar89._12_4_ = 0x40000000;
                auVar89._16_4_ = 0x40000000;
                auVar89._20_4_ = 0x40000000;
                auVar89._24_4_ = 0x40000000;
                auVar89._28_4_ = 0x40000000;
                auVar278 = vsubps_avx(auVar89,auVar22);
                auVar190._0_4_ = fVar49 + fVar49 + -1.0;
                auVar190._4_4_ = fVar63 + fVar63 + -1.0;
                auVar190._8_4_ = fVar93 + fVar93 + -1.0;
                auVar190._12_4_ = fVar94 + fVar94 + -1.0;
                auVar190._16_4_ = fVar199 + fVar199 + -1.0;
                auVar190._20_4_ = fVar95 + fVar95 + -1.0;
                auVar190._24_4_ = fVar196 + fVar196 + -1.0;
                auVar190._28_4_ = auVar215._28_4_ + auVar215._28_4_ + -1.0;
                auVar128._0_4_ = auVar190._0_4_ + fVar49 * auVar278._0_4_;
                auVar128._4_4_ = auVar190._4_4_ + fVar63 * auVar278._4_4_;
                auVar128._8_4_ = auVar190._8_4_ + fVar93 * auVar278._8_4_;
                auVar128._12_4_ = auVar190._12_4_ + fVar94 * auVar278._12_4_;
                auVar128._16_4_ = auVar190._16_4_ + fVar199 * auVar278._16_4_;
                auVar128._20_4_ = auVar190._20_4_ + fVar95 * auVar278._20_4_;
                auVar128._24_4_ = auVar190._24_4_ + fVar196 * auVar278._24_4_;
                goto LAB_004fc29b;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar190._4_4_ = fVar63;
                auVar190._0_4_ = fVar63;
                auVar190._8_4_ = fVar63;
                auVar190._12_4_ = fVar63;
                auVar190._16_4_ = fVar63;
                auVar190._20_4_ = fVar63;
                auVar190._24_4_ = fVar63;
                auVar190._28_4_ = fVar63;
                auVar143._0_4_ = auVar284._0_4_ * fVar49 + fVar63;
                auVar143._4_4_ = auVar284._4_4_ * fVar49 + fVar63;
                auVar143._8_4_ = fVar303 * fVar49 + fVar63;
                auVar143._12_4_ = fVar304 * fVar49 + fVar63;
                auVar143._16_4_ = fVar305 * fVar49 + fVar63;
                auVar143._20_4_ = fVar306 * fVar49 + fVar63;
                auVar143._24_4_ = fVar216 * fVar49 + fVar63;
                auVar143._28_4_ = fVar49 + fVar63;
                auVar278 = vmaxps_avx(auVar143,auVar92._0_32_);
                auVar215 = vminps_avx(auVar278,auVar215);
                auVar128 = auVar215._0_28_;
LAB_004fc29b:
                in_ZMM3 = ZEXT3264(auVar190);
                auVar286._0_4_ = auVar284._0_4_ * auVar128._0_4_;
                auVar286._4_4_ = auVar284._4_4_ * auVar128._4_4_;
                auVar286._8_4_ = fVar303 * auVar128._8_4_;
                auVar286._12_4_ = fVar304 * auVar128._12_4_;
                auVar286._16_4_ = fVar305 * auVar128._16_4_;
                auVar286._20_4_ = fVar306 * auVar128._20_4_;
                auVar286._24_4_ = fVar216 * auVar128._24_4_;
                auVar282 = auVar286._0_32_;
              }
              *pauVar34 = auVar282;
              pauVar34 = pauVar34 + 1;
              iVar39 = iVar39 + 4;
              bVar46 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar46);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar27);
      }
      bVar46 = 0 < (int)uVar27;
      bVar44 = iVar29 == 1;
      if (iVar2 == 8 && (bVar44 && bVar46)) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_50 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_58 = (this->weight_data_packed).data;
        local_38 = (ulong)uVar27;
        local_100 = 0;
        do {
          pvVar25 = local_40;
          pvVar8 = local_a8.data;
          if (-1 < iVar3) {
            lVar42 = local_48 * local_100;
            pfVar32 = (float *)(local_50 * local_100 + (long)local_58);
            lVar40 = (long)local_a8.w * local_a8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            uVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                fVar49 = 0.0;
              }
              else {
                fVar49 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var4) + local_100 * 4);
              }
              if (iVar26 < 1) {
                fVar63 = 0.0;
                fVar93 = 0.0;
                fVar94 = 0.0;
                fVar199 = 0.0;
                fVar95 = 0.0;
                fVar196 = 0.0;
                fVar198 = 0.0;
                fVar144 = 0.0;
              }
              else {
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)pvVar8 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                fVar63 = 0.0;
                fVar93 = 0.0;
                fVar94 = 0.0;
                fVar199 = 0.0;
                fVar95 = 0.0;
                fVar196 = 0.0;
                fVar198 = 0.0;
                fVar144 = 0.0;
                uVar36 = 0;
                pfVar31 = pfVar32;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar38 = pfVar43;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar63 = *pfVar31 * *pfVar38 + fVar63;
                      fVar93 = pfVar31[1] * pfVar38[1] + fVar93;
                      fVar94 = pfVar31[2] * pfVar38[2] + fVar94;
                      fVar199 = pfVar31[3] * pfVar38[3] + fVar199;
                      fVar95 = pfVar31[4] * pfVar38[4] + fVar95;
                      fVar196 = pfVar31[5] * pfVar38[5] + fVar196;
                      fVar198 = pfVar31[6] * pfVar38[6] + fVar198;
                      fVar144 = pfVar31[7] + fVar144;
                      pfVar31 = pfVar31 + 8;
                      pfVar38 = pfVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar36 = uVar36 + 1;
                  pfVar43 = (float *)((long)pfVar43 + lVar40);
                } while (uVar36 != uVar41);
              }
              auVar68._0_4_ = fVar95 + fVar63;
              auVar68._4_4_ = fVar196 + fVar93;
              auVar68._8_4_ = fVar198 + fVar94;
              auVar68._12_4_ = fVar144 + fVar199;
              auVar145 = vshufpd_avx(auVar68,auVar68,1);
              auVar69._0_4_ = auVar145._0_4_ + auVar68._0_4_;
              auVar69._4_4_ = auVar145._4_4_ + auVar68._4_4_;
              auVar69._8_4_ = auVar145._8_4_ + auVar68._8_4_;
              auVar69._12_4_ = auVar145._12_4_ + auVar68._12_4_;
              auVar145 = vmovshdup_avx(auVar69);
              fVar49 = auVar145._0_4_ + fVar49 + auVar69._0_4_;
              auVar145 = ZEXT416((uint)fVar49);
              fVar63 = fVar49;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar145 = vmaxss_avx(auVar145,ZEXT416(0));
                fVar63 = auVar145._0_4_;
                break;
              case 2:
                auVar53._0_12_ = ZEXT812(0);
                auVar53._12_4_ = 0;
                auVar145 = vcmpss_avx(auVar53,auVar145,1);
                auVar97._8_4_ = 0x3f800000;
                auVar97._0_8_ = 0x3f8000003f800000;
                auVar97._12_4_ = 0x3f800000;
                auVar145 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar97,auVar145);
                fVar94 = auVar145._0_4_;
LAB_004fc57c:
                fVar63 = fVar94 * fVar49;
                break;
              case 3:
                fVar49 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar145 = vmaxss_avx(auVar145,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                fVar63 = auVar145._0_4_;
                if (fVar49 < auVar145._0_4_) {
                  fVar63 = fVar49;
                }
                break;
              case 4:
                auVar145 = vminss_avx(auVar145,ZEXT416(0x42b0c0a5));
                auVar70._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar70._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar70._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar145 = vcmpss_avx(auVar145,ZEXT416(0xc2b0c0a5),1);
                auVar96._8_4_ = 0x42b0c0a5;
                auVar96._0_8_ = 0x42b0c0a542b0c0a5;
                auVar96._12_4_ = 0x42b0c0a5;
                auVar145 = vblendvps_avx(auVar70,auVar96,auVar145);
                fVar49 = expf(auVar145._0_4_);
                fVar63 = 1.0 / (fVar49 + 1.0);
                break;
              case 5:
                fVar63 = expf(fVar49);
                fVar63 = logf(fVar63 + 1.0);
                fVar63 = tanhf(fVar63);
                fVar63 = fVar63 * fVar49;
                break;
              case 6:
                fVar93 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar94 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar199 = -fVar94 / fVar93;
                fVar63 = 0.0;
                if ((fVar199 <= fVar49) && (fVar63 = fVar49, fVar49 <= fVar199 + 1.0 / fVar93)) {
                  fVar94 = fVar93 * fVar49 + fVar94;
                  goto LAB_004fc57c;
                }
              }
              *(float *)((long)pvVar25 + uVar37 * 4 + lVar42) = fVar63;
              uVar37 = uVar37 + 1;
              iVar30 = iVar30 + 8;
            } while (uVar37 != _w);
          }
          local_100 = local_100 + 1;
        } while (local_100 != local_38);
      }
      bVar45 = 0 < (int)uVar27;
      bVar47 = iVar29 == 4;
      if (iVar2 == 8 && (bVar47 && bVar45)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar211._8_4_ = 0x3f000000;
        auVar211._0_8_ = 0x3f0000003f000000;
        auVar211._12_4_ = 0x3f000000;
        auVar212._8_4_ = 0x3f800000;
        auVar212._0_8_ = 0x3f8000003f800000;
        auVar212._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar35 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar71 = ZEXT816(0) << 0x40;
              }
              else {
                auVar71 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_110 * 0x10);
              }
              auVar273 = ZEXT1664(auVar71);
              if (0 < iVar26) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)&((Allocator *)((long)local_a8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4 +
                                   4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-7];
                      fVar63 = pfVar31[-6];
                      fVar93 = pfVar31[-5];
                      fVar94 = pfVar31[-4];
                      fVar199 = pfVar31[-3];
                      fVar95 = pfVar31[-2];
                      fVar196 = pfVar31[-1];
                      fVar198 = *pfVar31;
                      auVar273 = ZEXT1664(CONCAT412(fVar49 * pfVar43[3] + auVar273._12_4_ +
                                                    fVar63 * pfVar43[7] + fVar93 * pfVar43[0xb] +
                                                    fVar94 * pfVar43[0xf] + fVar199 * pfVar43[0x13]
                                                    + fVar95 * pfVar43[0x17] +
                                                    fVar196 * pfVar43[0x1b] +
                                                    fVar198 * pfVar43[0x1f],
                                                    CONCAT48(fVar49 * pfVar43[2] + auVar273._8_4_ +
                                                             fVar63 * pfVar43[6] +
                                                             fVar93 * pfVar43[10] +
                                                             fVar94 * pfVar43[0xe] +
                                                             fVar199 * pfVar43[0x12] +
                                                             fVar95 * pfVar43[0x16] +
                                                             fVar196 * pfVar43[0x1a] +
                                                             fVar198 * pfVar43[0x1e],
                                                             CONCAT44(fVar49 * pfVar43[1] +
                                                                      auVar273._4_4_ +
                                                                      fVar63 * pfVar43[5] +
                                                                      fVar93 * pfVar43[9] +
                                                                      fVar94 * pfVar43[0xd] +
                                                                      fVar199 * pfVar43[0x11] +
                                                                      fVar95 * pfVar43[0x15] +
                                                                      fVar196 * pfVar43[0x19] +
                                                                      fVar198 * pfVar43[0x1d],
                                                                      fVar49 * *pfVar43 +
                                                                      auVar273._0_4_ +
                                                                      fVar63 * pfVar43[4] +
                                                                      fVar93 * pfVar43[8] +
                                                                      fVar94 * pfVar43[0xc] +
                                                                      fVar199 * pfVar43[0x10] +
                                                                      fVar95 * pfVar43[0x14] +
                                                                      fVar196 * pfVar43[0x18] +
                                                                      fVar198 * pfVar43[0x1c]))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  auVar71 = auVar273._0_16_;
                  uVar37 = uVar37 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar37 != uVar41);
              }
              auVar145 = auVar92._0_16_;
              fVar49 = auVar71._4_4_;
              fVar63 = auVar71._8_4_;
              fVar93 = auVar71._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar71 = vmaxps_avx(auVar145,auVar71);
                break;
              case 2:
                auVar217 = vmaxps_avx(auVar145,auVar71);
                auVar145 = vminps_avx(auVar145,auVar71);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar71._0_4_ = fVar49 * auVar145._0_4_ + auVar217._0_4_;
                auVar71._4_4_ = fVar49 * auVar145._4_4_ + auVar217._4_4_;
                auVar71._8_4_ = fVar49 * auVar145._8_4_ + auVar217._8_4_;
                auVar71._12_4_ = fVar49 * auVar145._12_4_ + auVar217._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar225._4_4_ = uVar1;
                auVar225._0_4_ = uVar1;
                auVar225._8_4_ = uVar1;
                auVar225._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar289._4_4_ = uVar1;
                auVar289._0_4_ = uVar1;
                auVar289._8_4_ = uVar1;
                auVar289._12_4_ = uVar1;
                auVar145 = vmaxps_avx(auVar71,auVar225);
                auVar71 = vminps_avx(auVar289,auVar145);
                break;
              case 4:
                auVar72._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                auVar72._8_4_ = -fVar63;
                auVar72._12_4_ = -fVar93;
                auVar103._8_4_ = 0x42b0c0a5;
                auVar103._0_8_ = 0x42b0c0a542b0c0a5;
                auVar103._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar72,auVar103);
                auVar104._8_4_ = 0xc2b0c0a5;
                auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar104._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar145,auVar104);
                auVar226._0_4_ = auVar208._0_4_ * 1.442695 + 0.5;
                auVar226._4_4_ = auVar208._4_4_ * 1.442695 + 0.5;
                auVar226._8_4_ = auVar208._8_4_ * 1.442695 + 0.5;
                auVar226._12_4_ = auVar208._12_4_ * 1.442695 + 0.5;
                auVar290._0_4_ = (int)auVar226._0_4_;
                auVar290._4_4_ = (int)auVar226._4_4_;
                auVar290._8_4_ = (int)auVar226._8_4_;
                auVar290._12_4_ = (int)auVar226._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar290);
                auVar145 = vcmpps_avx(auVar226,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar212);
                auVar145 = vsubps_avx(auVar217,auVar145);
                fVar49 = auVar145._0_4_ * -0.6931472 + auVar208._0_4_;
                fVar63 = auVar145._4_4_ * -0.6931472 + auVar208._4_4_;
                fVar93 = auVar145._8_4_ * -0.6931472 + auVar208._8_4_;
                fVar94 = auVar145._12_4_ * -0.6931472 + auVar208._12_4_;
                auVar227._0_4_ = (int)auVar145._0_4_;
                auVar227._4_4_ = (int)auVar145._4_4_;
                auVar227._8_4_ = (int)auVar145._8_4_;
                auVar227._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar227,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar212);
                auVar73._0_4_ =
                     (fVar49 * fVar49 *
                      (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                        0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) + fVar49 + 1.0) *
                     auVar145._0_4_ + 1.0;
                auVar73._4_4_ =
                     (fVar63 * fVar63 *
                      (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) * fVar63 +
                        0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) + fVar63 + 1.0) *
                     auVar145._4_4_ + 1.0;
                auVar73._8_4_ =
                     (fVar93 * fVar93 *
                      (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                        0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) + fVar93 + 1.0) *
                     auVar145._8_4_ + 1.0;
                auVar73._12_4_ =
                     (fVar94 * fVar94 *
                      (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                        0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) + fVar94 + 1.0) *
                     auVar145._12_4_ + 1.0;
                auVar145 = vrcpps_avx(auVar73);
                fVar49 = auVar145._0_4_;
                auVar74._0_4_ = auVar73._0_4_ * fVar49;
                fVar63 = auVar145._4_4_;
                auVar74._4_4_ = auVar73._4_4_ * fVar63;
                fVar93 = auVar145._8_4_;
                auVar74._8_4_ = auVar73._8_4_ * fVar93;
                fVar94 = auVar145._12_4_;
                auVar74._12_4_ = auVar73._12_4_ * fVar94;
                auVar145 = vsubps_avx(auVar212,auVar74);
                auVar71._0_4_ = fVar49 + fVar49 * auVar145._0_4_;
                auVar71._4_4_ = fVar63 + fVar63 * auVar145._4_4_;
                auVar71._8_4_ = fVar93 + fVar93 * auVar145._8_4_;
                auVar71._12_4_ = fVar94 + fVar94 * auVar145._12_4_;
                break;
              case 5:
                auVar200._8_4_ = 0x42b0c0a5;
                auVar200._0_8_ = 0x42b0c0a542b0c0a5;
                auVar200._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar71,auVar200);
                auVar264._8_4_ = 0xc2b0c0a5;
                auVar264._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar264._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar264,auVar145);
                auVar274._0_4_ = auVar208._0_4_ * 1.442695 + 0.5;
                auVar274._4_4_ = auVar208._4_4_ * 1.442695 + 0.5;
                auVar274._8_4_ = auVar208._8_4_ * 1.442695 + 0.5;
                auVar274._12_4_ = auVar208._12_4_ * 1.442695 + 0.5;
                auVar287._0_4_ = (int)auVar274._0_4_;
                auVar287._4_4_ = (int)auVar274._4_4_;
                auVar287._8_4_ = (int)auVar274._8_4_;
                auVar287._12_4_ = (int)auVar274._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar287);
                auVar145 = vcmpps_avx(auVar274,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar212);
                auVar145 = vsubps_avx(auVar217,auVar145);
                auVar288._0_4_ = auVar145._0_4_ * 0.6931472;
                auVar288._4_4_ = auVar145._4_4_ * 0.6931472;
                auVar288._8_4_ = auVar145._8_4_ * 0.6931472;
                auVar288._12_4_ = auVar145._12_4_ * 0.6931472;
                auVar217 = vsubps_avx(auVar208,auVar288);
                fVar94 = auVar217._0_4_;
                fVar199 = auVar217._4_4_;
                fVar95 = auVar217._8_4_;
                fVar196 = auVar217._12_4_;
                auVar221._0_4_ = (int)auVar145._0_4_;
                auVar221._4_4_ = (int)auVar145._4_4_;
                auVar221._8_4_ = (int)auVar145._8_4_;
                auVar221._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar221,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar212);
                auVar222._0_4_ =
                     (fVar94 + 1.0 +
                     fVar94 * fVar94 *
                     (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                       0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5)) * auVar145._0_4_ + 1.0;
                auVar222._4_4_ =
                     (fVar199 + 1.0 +
                     fVar199 * fVar199 *
                     (((((fVar199 * 0.00019875691 + 0.0013981999) * fVar199 + 0.008333452) * fVar199
                       + 0.041665796) * fVar199 + 0.16666666) * fVar199 + 0.5)) * auVar145._4_4_ +
                     1.0;
                auVar222._8_4_ =
                     (fVar95 + 1.0 +
                     fVar95 * fVar95 *
                     (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                       0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar145._8_4_ + 1.0;
                auVar222._12_4_ =
                     (fVar196 + 1.0 +
                     fVar196 * fVar196 *
                     (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) * fVar196
                       + 0.041665796) * fVar196 + 0.16666666) * fVar196 + 0.5)) * auVar145._12_4_ +
                     1.0;
                auVar98._8_4_ = 0x800000;
                auVar98._0_8_ = 0x80000000800000;
                auVar98._12_4_ = 0x800000;
                auVar145 = vmaxps_avx(auVar222,auVar98);
                auVar217 = vpsrld_avx(auVar145,0x17);
                auVar150._8_4_ = 0xffffff82;
                auVar150._0_8_ = 0xffffff82ffffff82;
                auVar150._12_4_ = 0xffffff82;
                auVar217 = vpaddd_avx(auVar217,auVar150);
                auVar151._8_4_ = 0x807fffff;
                auVar151._0_8_ = 0x807fffff807fffff;
                auVar151._12_4_ = 0x807fffff;
                auVar145 = vandps_avx(auVar145,auVar151);
                auVar263 = vorps_avx(auVar145,auVar211);
                auVar208 = vcvtdq2ps_avx(auVar217);
                auVar152._8_4_ = 0x3f3504f3;
                auVar152._0_8_ = 0x3f3504f33f3504f3;
                auVar152._12_4_ = 0x3f3504f3;
                auVar217 = vcmpps_avx(auVar263,auVar152,1);
                auVar145 = vandps_avx(auVar217,auVar263);
                fVar94 = auVar263._0_4_ + -1.0 + auVar145._0_4_;
                fVar199 = auVar263._4_4_ + -1.0 + auVar145._4_4_;
                fVar95 = auVar263._8_4_ + -1.0 + auVar145._8_4_;
                fVar196 = auVar263._12_4_ + -1.0 + auVar145._12_4_;
                auVar145 = vandps_avx(auVar217,auVar212);
                auVar217 = vsubps_avx(auVar208,auVar145);
                auVar145 = vcmpps_avx(auVar222,_DAT_00516060,2);
                auVar99._0_4_ =
                     (fVar94 * fVar94 *
                      (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) * fVar94 +
                            -0.12420141) * fVar94 + 0.14249323) * fVar94 + -0.16668057) * fVar94 +
                         0.20000714) * fVar94 + -0.24999994) * fVar94 + 0.3333333) * fVar94 + -0.5)
                     + auVar217._0_4_ * 0.6931472 + fVar94) * -2.0;
                auVar99._4_4_ =
                     (fVar199 * fVar199 *
                      (((((((((fVar199 * 0.070376836 + -0.1151461) * fVar199 + 0.116769984) *
                             fVar199 + -0.12420141) * fVar199 + 0.14249323) * fVar199 + -0.16668057)
                          * fVar199 + 0.20000714) * fVar199 + -0.24999994) * fVar199 + 0.3333333) *
                       fVar199 + -0.5) + auVar217._4_4_ * 0.6931472 + fVar199) * -2.0;
                auVar99._8_4_ =
                     (fVar95 * fVar95 *
                      (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 + 0.116769984) * fVar95 +
                            -0.12420141) * fVar95 + 0.14249323) * fVar95 + -0.16668057) * fVar95 +
                         0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333) * fVar95 + -0.5)
                     + auVar217._8_4_ * 0.6931472 + fVar95) * -2.0;
                auVar99._12_4_ =
                     (fVar196 * fVar196 *
                      (((((((((fVar196 * 0.070376836 + -0.1151461) * fVar196 + 0.116769984) *
                             fVar196 + -0.12420141) * fVar196 + 0.14249323) * fVar196 + -0.16668057)
                          * fVar196 + 0.20000714) * fVar196 + -0.24999994) * fVar196 + 0.3333333) *
                       fVar196 + -0.5) + auVar217._12_4_ * 0.6931472 + fVar196) * -2.0;
                auVar153._8_4_ = 0x7fffffff;
                auVar153._0_8_ = 0x7fffffff7fffffff;
                auVar153._12_4_ = 0x7fffffff;
                auVar145 = vblendvps_avx(auVar99,auVar153,auVar145);
                auVar154._8_4_ = 0x42b0c0a5;
                auVar154._0_8_ = 0x42b0c0a542b0c0a5;
                auVar154._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar145,auVar154);
                auVar155._8_4_ = 0xc2b0c0a5;
                auVar155._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar155._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar145,auVar155);
                auVar156._0_4_ = auVar208._0_4_ * 1.442695 + 0.5;
                auVar156._4_4_ = auVar208._4_4_ * 1.442695 + 0.5;
                auVar156._8_4_ = auVar208._8_4_ * 1.442695 + 0.5;
                auVar156._12_4_ = auVar208._12_4_ * 1.442695 + 0.5;
                auVar223._0_4_ = (int)auVar156._0_4_;
                auVar223._4_4_ = (int)auVar156._4_4_;
                auVar223._8_4_ = (int)auVar156._8_4_;
                auVar223._12_4_ = (int)auVar156._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar223);
                auVar145 = vcmpps_avx(auVar156,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar212);
                auVar145 = vsubps_avx(auVar217,auVar145);
                auVar224._0_4_ = auVar145._0_4_ * 0.6931472;
                auVar224._4_4_ = auVar145._4_4_ * 0.6931472;
                auVar224._8_4_ = auVar145._8_4_ * 0.6931472;
                auVar224._12_4_ = auVar145._12_4_ * 0.6931472;
                auVar217 = vsubps_avx(auVar208,auVar224);
                fVar94 = auVar217._0_4_;
                fVar199 = auVar217._4_4_;
                fVar95 = auVar217._8_4_;
                fVar196 = auVar217._12_4_;
                auVar92 = ZEXT864(0) << 0x20;
                auVar157._0_4_ = (int)auVar145._0_4_;
                auVar157._4_4_ = (int)auVar145._4_4_;
                auVar157._8_4_ = (int)auVar145._8_4_;
                auVar157._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar157,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar212);
                auVar100._0_4_ =
                     (fVar94 + 1.0 +
                     (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                       0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) * fVar94 * fVar94) *
                     auVar145._0_4_ + 1.0;
                auVar100._4_4_ =
                     (fVar199 + 1.0 +
                     (((((fVar199 * 0.00019875691 + 0.0013981999) * fVar199 + 0.008333452) * fVar199
                       + 0.041665796) * fVar199 + 0.16666666) * fVar199 + 0.5) * fVar199 * fVar199)
                     * auVar145._4_4_ + 1.0;
                auVar100._8_4_ =
                     (fVar95 + 1.0 +
                     (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                       0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5) * fVar95 * fVar95) *
                     auVar145._8_4_ + 1.0;
                auVar100._12_4_ =
                     (fVar196 + 1.0 +
                     (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) * fVar196
                       + 0.041665796) * fVar196 + 0.16666666) * fVar196 + 0.5) * fVar196 * fVar196)
                     * auVar145._12_4_ + 1.0;
                auVar145 = vrcpps_avx(auVar100);
                fVar94 = auVar145._0_4_;
                fVar199 = auVar145._4_4_;
                fVar95 = auVar145._8_4_;
                fVar196 = auVar145._12_4_;
                auVar101._0_4_ = auVar100._0_4_ * (fVar94 + fVar94);
                auVar101._4_4_ = auVar100._4_4_ * (fVar199 + fVar199);
                auVar101._8_4_ = auVar100._8_4_ * (fVar95 + fVar95);
                auVar101._12_4_ = auVar100._12_4_ * (fVar196 + fVar196);
                auVar201._8_4_ = 0x40000000;
                auVar201._0_8_ = 0x4000000040000000;
                auVar201._12_4_ = 0x40000000;
                auVar145 = vsubps_avx(auVar201,auVar101);
                auVar102._0_4_ = fVar94 + fVar94 + -1.0 + fVar94 * auVar145._0_4_;
                auVar102._4_4_ = fVar199 + fVar199 + -1.0 + fVar199 * auVar145._4_4_;
                auVar102._8_4_ = fVar95 + fVar95 + -1.0 + fVar95 * auVar145._8_4_;
                auVar102._12_4_ = fVar196 + fVar196 + -1.0 + fVar196 * auVar145._12_4_;
                goto LAB_004fcc39;
              case 6:
                fVar94 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar199 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar105._0_4_ = fVar94 * auVar71._0_4_ + fVar199;
                auVar105._4_4_ = fVar94 * fVar49 + fVar199;
                auVar105._8_4_ = fVar94 * fVar63 + fVar199;
                auVar105._12_4_ = fVar94 * fVar93 + fVar199;
                auVar145 = vmaxps_avx(auVar145,auVar105);
                auVar102 = vminps_avx(auVar145,auVar212);
LAB_004fcc39:
                auVar71._0_4_ = auVar102._0_4_ * auVar71._0_4_;
                auVar71._4_4_ = auVar102._4_4_ * fVar49;
                auVar71._8_4_ = auVar102._8_4_ * fVar63;
                auVar71._12_4_ = auVar102._12_4_ * fVar93;
              }
              *pauVar35 = auVar71;
              pauVar35 = pauVar35 + 1;
              iVar39 = iVar39 + 8;
              bVar48 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar48);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar27);
      }
      if (iVar2 == 4 && (bVar47 && bVar45)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar92 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar213._8_4_ = 0x3f800000;
        auVar213._0_8_ = 0x3f8000003f800000;
        auVar213._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar35 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar39 = 0;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar75 = ZEXT816(0) << 0x40;
              }
              else {
                auVar75 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_110 * 0x10);
              }
              auVar273 = ZEXT1664(auVar75);
              if (0 < iVar26) {
                pfVar32 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar39) * 4
                                     + 4);
                uVar37 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar43;
                    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = pfVar31[-3];
                      fVar63 = pfVar31[-2];
                      fVar93 = pfVar31[-1];
                      fVar94 = *pfVar31;
                      auVar273 = ZEXT1664(CONCAT412(fVar49 * pfVar32[3] + auVar273._12_4_ +
                                                    fVar63 * pfVar32[7] + fVar93 * pfVar32[0xb] +
                                                    fVar94 * pfVar32[0xf],
                                                    CONCAT48(fVar49 * pfVar32[2] + auVar273._8_4_ +
                                                             fVar63 * pfVar32[6] +
                                                             fVar93 * pfVar32[10] +
                                                             fVar94 * pfVar32[0xe],
                                                             CONCAT44(fVar49 * pfVar32[1] +
                                                                      auVar273._4_4_ +
                                                                      fVar63 * pfVar32[5] +
                                                                      fVar93 * pfVar32[9] +
                                                                      fVar94 * pfVar32[0xd],
                                                                      fVar49 * *pfVar32 +
                                                                      auVar273._0_4_ +
                                                                      fVar63 * pfVar32[4] +
                                                                      fVar93 * pfVar32[8] +
                                                                      fVar94 * pfVar32[0xc]))));
                      pfVar32 = pfVar32 + 0x10;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                  auVar75 = auVar273._0_16_;
                  uVar37 = uVar37 + 1;
                  pfVar43 = (float *)((long)pfVar43 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar37 != uVar41);
              }
              fVar49 = auVar92._0_4_;
              fVar63 = auVar92._4_4_;
              fVar93 = auVar92._8_4_;
              fVar94 = auVar92._12_4_;
              fVar199 = auVar75._4_4_;
              fVar95 = auVar75._8_4_;
              fVar196 = auVar75._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar75 = vmaxps_avx(auVar75,_DAT_00516060);
                break;
              case 2:
                auVar145 = vmaxps_avx(auVar75,ZEXT816(0) << 0x40);
                auVar217 = vminps_avx(auVar75,ZEXT816(0) << 0x40);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar75._0_4_ = fVar49 * auVar217._0_4_ + auVar145._0_4_;
                auVar75._4_4_ = fVar49 * auVar217._4_4_ + auVar145._4_4_;
                auVar75._8_4_ = fVar49 * auVar217._8_4_ + auVar145._8_4_;
                auVar75._12_4_ = fVar49 * auVar217._12_4_ + auVar145._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar232._4_4_ = uVar1;
                auVar232._0_4_ = uVar1;
                auVar232._8_4_ = uVar1;
                auVar232._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar293._4_4_ = uVar1;
                auVar293._0_4_ = uVar1;
                auVar293._8_4_ = uVar1;
                auVar293._12_4_ = uVar1;
                auVar145 = vmaxps_avx(auVar75,auVar232);
                auVar75 = vminps_avx(auVar293,auVar145);
                break;
              case 4:
                auVar76._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                auVar76._8_4_ = -fVar95;
                auVar76._12_4_ = -fVar196;
                auVar111._8_4_ = 0x42b0c0a5;
                auVar111._0_8_ = 0x42b0c0a542b0c0a5;
                auVar111._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar76,auVar111);
                auVar112._8_4_ = 0xc2b0c0a5;
                auVar112._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar112._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar145,auVar112);
                auVar233._0_4_ = fVar49 + auVar208._0_4_ * 1.442695;
                auVar233._4_4_ = fVar63 + auVar208._4_4_ * 1.442695;
                auVar233._8_4_ = fVar93 + auVar208._8_4_ * 1.442695;
                auVar233._12_4_ = fVar94 + auVar208._12_4_ * 1.442695;
                auVar294._0_4_ = (int)auVar233._0_4_;
                auVar294._4_4_ = (int)auVar233._4_4_;
                auVar294._8_4_ = (int)auVar233._8_4_;
                auVar294._12_4_ = (int)auVar233._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar294);
                auVar145 = vcmpps_avx(auVar233,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar213);
                auVar145 = vsubps_avx(auVar217,auVar145);
                fVar199 = auVar145._0_4_ * -0.6931472 + auVar208._0_4_;
                fVar95 = auVar145._4_4_ * -0.6931472 + auVar208._4_4_;
                fVar196 = auVar145._8_4_ * -0.6931472 + auVar208._8_4_;
                fVar198 = auVar145._12_4_ * -0.6931472 + auVar208._12_4_;
                auVar234._0_4_ = (int)auVar145._0_4_;
                auVar234._4_4_ = (int)auVar145._4_4_;
                auVar234._8_4_ = (int)auVar145._8_4_;
                auVar234._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar234,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar213);
                auVar77._0_4_ =
                     (fVar199 * fVar199 *
                      (((((fVar199 * 0.00019875691 + 0.0013981999) * fVar199 + 0.008333452) *
                         fVar199 + 0.041665796) * fVar199 + 0.16666666) * fVar199 + fVar49) +
                     fVar199 + 1.0) * auVar145._0_4_ + 1.0;
                auVar77._4_4_ =
                     (fVar95 * fVar95 *
                      (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                        0.041665796) * fVar95 + 0.16666666) * fVar95 + fVar63) + fVar95 + 1.0) *
                     auVar145._4_4_ + 1.0;
                auVar77._8_4_ =
                     (fVar196 * fVar196 *
                      (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) *
                         fVar196 + 0.041665796) * fVar196 + 0.16666666) * fVar196 + fVar93) +
                     fVar196 + 1.0) * auVar145._8_4_ + 1.0;
                auVar77._12_4_ =
                     (fVar198 * fVar198 *
                      (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) *
                         fVar198 + 0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar94) +
                     fVar198 + 1.0) * auVar145._12_4_ + 1.0;
                auVar145 = vrcpps_avx(auVar77);
                fVar49 = auVar145._0_4_;
                auVar78._0_4_ = auVar77._0_4_ * fVar49;
                fVar63 = auVar145._4_4_;
                auVar78._4_4_ = auVar77._4_4_ * fVar63;
                fVar93 = auVar145._8_4_;
                auVar78._8_4_ = auVar77._8_4_ * fVar93;
                fVar94 = auVar145._12_4_;
                auVar78._12_4_ = auVar77._12_4_ * fVar94;
                auVar145 = vsubps_avx(auVar213,auVar78);
                auVar75._0_4_ = fVar49 + fVar49 * auVar145._0_4_;
                auVar75._4_4_ = fVar63 + fVar63 * auVar145._4_4_;
                auVar75._8_4_ = fVar93 + fVar93 * auVar145._8_4_;
                auVar75._12_4_ = fVar94 + fVar94 * auVar145._12_4_;
                break;
              case 5:
                auVar202._8_4_ = 0x42b0c0a5;
                auVar202._0_8_ = 0x42b0c0a542b0c0a5;
                auVar202._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar75,auVar202);
                auVar265._8_4_ = 0xc2b0c0a5;
                auVar265._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar265._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar265,auVar145);
                auVar275._0_4_ = auVar208._0_4_ * 1.442695 + fVar49;
                auVar275._4_4_ = auVar208._4_4_ * 1.442695 + fVar63;
                auVar275._8_4_ = auVar208._8_4_ * 1.442695 + fVar93;
                auVar275._12_4_ = auVar208._12_4_ * 1.442695 + fVar94;
                auVar291._0_4_ = (int)auVar275._0_4_;
                auVar291._4_4_ = (int)auVar275._4_4_;
                auVar291._8_4_ = (int)auVar275._8_4_;
                auVar291._12_4_ = (int)auVar275._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar291);
                auVar145 = vcmpps_avx(auVar275,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar213);
                auVar145 = vsubps_avx(auVar217,auVar145);
                auVar292._0_4_ = auVar145._0_4_ * 0.6931472;
                auVar292._4_4_ = auVar145._4_4_ * 0.6931472;
                auVar292._8_4_ = auVar145._8_4_ * 0.6931472;
                auVar292._12_4_ = auVar145._12_4_ * 0.6931472;
                auVar217 = vsubps_avx(auVar208,auVar292);
                fVar198 = auVar217._0_4_;
                fVar144 = auVar217._4_4_;
                fVar191 = auVar217._8_4_;
                fVar192 = auVar217._12_4_;
                auVar228._0_4_ = (int)auVar145._0_4_;
                auVar228._4_4_ = (int)auVar145._4_4_;
                auVar228._8_4_ = (int)auVar145._8_4_;
                auVar228._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar228,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar213);
                auVar229._0_4_ =
                     (fVar198 + 1.0 +
                     fVar198 * fVar198 *
                     (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) * fVar198
                       + 0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar49)) * auVar145._0_4_
                     + 1.0;
                auVar229._4_4_ =
                     (fVar144 + 1.0 +
                     fVar144 * fVar144 *
                     (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144
                       + 0.041665796) * fVar144 + 0.16666666) * fVar144 + fVar63)) * auVar145._4_4_
                     + 1.0;
                auVar229._8_4_ =
                     (fVar191 + 1.0 +
                     fVar191 * fVar191 *
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + fVar93)) * auVar145._8_4_
                     + 1.0;
                auVar229._12_4_ =
                     (fVar192 + 1.0 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar94)) * auVar145._12_4_
                     + 1.0;
                auVar106._8_4_ = 0x800000;
                auVar106._0_8_ = 0x80000000800000;
                auVar106._12_4_ = 0x800000;
                auVar145 = vmaxps_avx(auVar229,auVar106);
                auVar217 = vpsrld_avx(auVar145,0x17);
                auVar158._8_4_ = 0xffffff82;
                auVar158._0_8_ = 0xffffff82ffffff82;
                auVar158._12_4_ = 0xffffff82;
                auVar217 = vpaddd_avx(auVar217,auVar158);
                auVar159._8_4_ = 0x807fffff;
                auVar159._0_8_ = 0x807fffff807fffff;
                auVar159._12_4_ = 0x807fffff;
                auVar145 = vandps_avx(auVar145,auVar159);
                auVar263 = vorps_avx(auVar145,auVar92._0_16_);
                auVar208 = vcvtdq2ps_avx(auVar217);
                auVar160._8_4_ = 0x3f3504f3;
                auVar160._0_8_ = 0x3f3504f33f3504f3;
                auVar160._12_4_ = 0x3f3504f3;
                auVar217 = vcmpps_avx(auVar263,auVar160,1);
                auVar145 = vandps_avx(auVar217,auVar263);
                fVar198 = auVar263._0_4_ + -1.0 + auVar145._0_4_;
                fVar144 = auVar263._4_4_ + -1.0 + auVar145._4_4_;
                fVar191 = auVar263._8_4_ + -1.0 + auVar145._8_4_;
                fVar192 = auVar263._12_4_ + -1.0 + auVar145._12_4_;
                auVar145 = vandps_avx(auVar217,auVar213);
                auVar217 = vsubps_avx(auVar208,auVar145);
                auVar145 = vcmpps_avx(auVar229,_DAT_00516060,2);
                auVar107._0_4_ =
                     (fVar198 * fVar198 *
                      (((((((((fVar198 * 0.070376836 + -0.1151461) * fVar198 + 0.116769984) *
                             fVar198 + -0.12420141) * fVar198 + 0.14249323) * fVar198 + -0.16668057)
                          * fVar198 + 0.20000714) * fVar198 + -0.24999994) * fVar198 + 0.3333333) *
                       fVar198 + -0.5) + auVar217._0_4_ * 0.6931472 + fVar198) * -2.0;
                auVar107._4_4_ =
                     (fVar144 * fVar144 *
                      (((((((((fVar144 * 0.070376836 + -0.1151461) * fVar144 + 0.116769984) *
                             fVar144 + -0.12420141) * fVar144 + 0.14249323) * fVar144 + -0.16668057)
                          * fVar144 + 0.20000714) * fVar144 + -0.24999994) * fVar144 + 0.3333333) *
                       fVar144 + -0.5) + auVar217._4_4_ * 0.6931472 + fVar144) * -2.0;
                auVar107._8_4_ =
                     (fVar191 * fVar191 *
                      (((((((((fVar191 * 0.070376836 + -0.1151461) * fVar191 + 0.116769984) *
                             fVar191 + -0.12420141) * fVar191 + 0.14249323) * fVar191 + -0.16668057)
                          * fVar191 + 0.20000714) * fVar191 + -0.24999994) * fVar191 + 0.3333333) *
                       fVar191 + -0.5) + auVar217._8_4_ * 0.6931472 + fVar191) * -2.0;
                auVar107._12_4_ =
                     (fVar192 * fVar192 *
                      (((((((((fVar192 * 0.070376836 + -0.1151461) * fVar192 + 0.116769984) *
                             fVar192 + -0.12420141) * fVar192 + 0.14249323) * fVar192 + -0.16668057)
                          * fVar192 + 0.20000714) * fVar192 + -0.24999994) * fVar192 + 0.3333333) *
                       fVar192 + -0.5) + auVar217._12_4_ * 0.6931472 + fVar192) * -2.0;
                auVar161._8_4_ = 0x7fffffff;
                auVar161._0_8_ = 0x7fffffff7fffffff;
                auVar161._12_4_ = 0x7fffffff;
                auVar145 = vblendvps_avx(auVar107,auVar161,auVar145);
                auVar162._8_4_ = 0x42b0c0a5;
                auVar162._0_8_ = 0x42b0c0a542b0c0a5;
                auVar162._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar145,auVar162);
                auVar163._8_4_ = 0xc2b0c0a5;
                auVar163._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar163._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar145,auVar163);
                auVar164._0_4_ = auVar208._0_4_ * 1.442695 + fVar49;
                auVar164._4_4_ = auVar208._4_4_ * 1.442695 + fVar63;
                auVar164._8_4_ = auVar208._8_4_ * 1.442695 + fVar93;
                auVar164._12_4_ = auVar208._12_4_ * 1.442695 + fVar94;
                auVar230._0_4_ = (int)auVar164._0_4_;
                auVar230._4_4_ = (int)auVar164._4_4_;
                auVar230._8_4_ = (int)auVar164._8_4_;
                auVar230._12_4_ = (int)auVar164._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar230);
                auVar145 = vcmpps_avx(auVar164,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar213);
                auVar145 = vsubps_avx(auVar217,auVar145);
                auVar231._0_4_ = auVar145._0_4_ * 0.6931472;
                auVar231._4_4_ = auVar145._4_4_ * 0.6931472;
                auVar231._8_4_ = auVar145._8_4_ * 0.6931472;
                auVar231._12_4_ = auVar145._12_4_ * 0.6931472;
                auVar217 = vsubps_avx(auVar208,auVar231);
                fVar198 = auVar217._0_4_;
                fVar144 = auVar217._4_4_;
                fVar191 = auVar217._8_4_;
                fVar192 = auVar217._12_4_;
                auVar92 = ZEXT1664(auVar92._0_16_);
                auVar165._0_4_ = (int)auVar145._0_4_;
                auVar165._4_4_ = (int)auVar145._4_4_;
                auVar165._8_4_ = (int)auVar145._8_4_;
                auVar165._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar165,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar213);
                auVar108._0_4_ =
                     (fVar198 + 1.0 +
                     (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) * fVar198
                       + 0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar49) *
                     fVar198 * fVar198) * auVar145._0_4_ + 1.0;
                auVar108._4_4_ =
                     (fVar144 + 1.0 +
                     (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144
                       + 0.041665796) * fVar144 + 0.16666666) * fVar144 + fVar63) *
                     fVar144 * fVar144) * auVar145._4_4_ + 1.0;
                auVar108._8_4_ =
                     (fVar191 + 1.0 +
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + fVar93) *
                     fVar191 * fVar191) * auVar145._8_4_ + 1.0;
                auVar108._12_4_ =
                     (fVar192 + 1.0 +
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar94) *
                     fVar192 * fVar192) * auVar145._12_4_ + 1.0;
                auVar145 = vrcpps_avx(auVar108);
                fVar49 = auVar145._0_4_;
                fVar63 = auVar145._4_4_;
                fVar93 = auVar145._8_4_;
                fVar94 = auVar145._12_4_;
                auVar109._0_4_ = auVar108._0_4_ * (fVar49 + fVar49);
                auVar109._4_4_ = auVar108._4_4_ * (fVar63 + fVar63);
                auVar109._8_4_ = auVar108._8_4_ * (fVar93 + fVar93);
                auVar109._12_4_ = auVar108._12_4_ * (fVar94 + fVar94);
                auVar203._8_4_ = 0x40000000;
                auVar203._0_8_ = 0x4000000040000000;
                auVar203._12_4_ = 0x40000000;
                auVar145 = vsubps_avx(auVar203,auVar109);
                auVar110._0_4_ = fVar49 + fVar49 + -1.0 + fVar49 * auVar145._0_4_;
                auVar110._4_4_ = fVar63 + fVar63 + -1.0 + fVar63 * auVar145._4_4_;
                auVar110._8_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar145._8_4_;
                auVar110._12_4_ = fVar94 + fVar94 + -1.0 + fVar94 * auVar145._12_4_;
                goto LAB_004fd24e;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar113._0_4_ = fVar49 * auVar75._0_4_ + fVar63;
                auVar113._4_4_ = fVar49 * fVar199 + fVar63;
                auVar113._8_4_ = fVar49 * fVar95 + fVar63;
                auVar113._12_4_ = fVar49 * fVar196 + fVar63;
                auVar145 = vmaxps_avx(auVar113,_DAT_00516060);
                auVar110 = vminps_avx(auVar145,auVar213);
LAB_004fd24e:
                auVar75._0_4_ = auVar110._0_4_ * auVar75._0_4_;
                auVar75._4_4_ = auVar110._4_4_ * fVar199;
                auVar75._8_4_ = auVar110._8_4_ * fVar95;
                auVar75._12_4_ = auVar110._12_4_ * fVar196;
              }
              *pauVar35 = auVar75;
              pauVar35 = pauVar35 + 1;
              iVar39 = iVar39 + 4;
              bVar48 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar48);
          }
          local_110 = local_110 + 1;
        } while (local_110 != uVar27);
      }
      if ((bVar47 && bVar45) && iVar2 == 1) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar37 = 0;
        auVar92 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar214._8_4_ = 0x3f800000;
        auVar214._0_8_ = 0x3f8000003f800000;
        auVar214._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar35 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar37 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar79 = ZEXT816(0) << 0x40;
              }
              else {
                auVar79 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar37 * 0x10);
              }
              auVar273 = ZEXT1664(auVar79);
              if (0 < iVar26) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * uVar37 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                pfVar32 = (float *)((long)(_func_int ***)local_a8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                uVar36 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar31 = pfVar32;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      fVar49 = *pfVar31;
                      auVar273 = ZEXT1664(CONCAT412(fVar49 * pfVar43[3] + auVar273._12_4_,
                                                    CONCAT48(fVar49 * pfVar43[2] + auVar273._8_4_,
                                                             CONCAT44(fVar49 * pfVar43[1] +
                                                                      auVar273._4_4_,
                                                                      fVar49 * *pfVar43 +
                                                                      auVar273._0_4_))));
                      pfVar43 = pfVar43 + 4;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar79 = auVar273._0_16_;
                  uVar36 = uVar36 + 1;
                  pfVar32 = (float *)((long)pfVar32 + (long)local_a8.w * local_a8.elemsize);
                } while (uVar36 != uVar41);
              }
              fVar49 = auVar92._0_4_;
              fVar63 = auVar92._4_4_;
              fVar93 = auVar92._8_4_;
              fVar94 = auVar92._12_4_;
              fVar199 = auVar79._4_4_;
              fVar95 = auVar79._8_4_;
              fVar196 = auVar79._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar79 = vmaxps_avx(auVar79,_DAT_00516060);
                break;
              case 2:
                auVar145 = vmaxps_avx(auVar79,ZEXT816(0) << 0x40);
                auVar217 = vminps_avx(auVar79,ZEXT816(0) << 0x40);
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar79._0_4_ = fVar49 * auVar217._0_4_ + auVar145._0_4_;
                auVar79._4_4_ = fVar49 * auVar217._4_4_ + auVar145._4_4_;
                auVar79._8_4_ = fVar49 * auVar217._8_4_ + auVar145._8_4_;
                auVar79._12_4_ = fVar49 * auVar217._12_4_ + auVar145._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar239._4_4_ = uVar1;
                auVar239._0_4_ = uVar1;
                auVar239._8_4_ = uVar1;
                auVar239._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar297._4_4_ = uVar1;
                auVar297._0_4_ = uVar1;
                auVar297._8_4_ = uVar1;
                auVar297._12_4_ = uVar1;
                auVar145 = vmaxps_avx(auVar79,auVar239);
                auVar79 = vminps_avx(auVar297,auVar145);
                break;
              case 4:
                auVar80._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                auVar80._8_4_ = -fVar95;
                auVar80._12_4_ = -fVar196;
                auVar119._8_4_ = 0x42b0c0a5;
                auVar119._0_8_ = 0x42b0c0a542b0c0a5;
                auVar119._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar80,auVar119);
                auVar120._8_4_ = 0xc2b0c0a5;
                auVar120._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar120._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar145,auVar120);
                auVar240._0_4_ = fVar49 + auVar208._0_4_ * 1.442695;
                auVar240._4_4_ = fVar63 + auVar208._4_4_ * 1.442695;
                auVar240._8_4_ = fVar93 + auVar208._8_4_ * 1.442695;
                auVar240._12_4_ = fVar94 + auVar208._12_4_ * 1.442695;
                auVar298._0_4_ = (int)auVar240._0_4_;
                auVar298._4_4_ = (int)auVar240._4_4_;
                auVar298._8_4_ = (int)auVar240._8_4_;
                auVar298._12_4_ = (int)auVar240._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar298);
                auVar145 = vcmpps_avx(auVar240,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar214);
                auVar145 = vsubps_avx(auVar217,auVar145);
                fVar199 = auVar145._0_4_ * -0.6931472 + auVar208._0_4_;
                fVar95 = auVar145._4_4_ * -0.6931472 + auVar208._4_4_;
                fVar196 = auVar145._8_4_ * -0.6931472 + auVar208._8_4_;
                fVar198 = auVar145._12_4_ * -0.6931472 + auVar208._12_4_;
                auVar241._0_4_ = (int)auVar145._0_4_;
                auVar241._4_4_ = (int)auVar145._4_4_;
                auVar241._8_4_ = (int)auVar145._8_4_;
                auVar241._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar241,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar214);
                auVar81._0_4_ =
                     (fVar199 * fVar199 *
                      (((((fVar199 * 0.00019875691 + 0.0013981999) * fVar199 + 0.008333452) *
                         fVar199 + 0.041665796) * fVar199 + 0.16666666) * fVar199 + fVar49) +
                     fVar199 + 1.0) * auVar145._0_4_ + 1.0;
                auVar81._4_4_ =
                     (fVar95 * fVar95 *
                      (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                        0.041665796) * fVar95 + 0.16666666) * fVar95 + fVar63) + fVar95 + 1.0) *
                     auVar145._4_4_ + 1.0;
                auVar81._8_4_ =
                     (fVar196 * fVar196 *
                      (((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) *
                         fVar196 + 0.041665796) * fVar196 + 0.16666666) * fVar196 + fVar93) +
                     fVar196 + 1.0) * auVar145._8_4_ + 1.0;
                auVar81._12_4_ =
                     (fVar198 * fVar198 *
                      (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) *
                         fVar198 + 0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar94) +
                     fVar198 + 1.0) * auVar145._12_4_ + 1.0;
                auVar145 = vrcpps_avx(auVar81);
                fVar49 = auVar145._0_4_;
                auVar82._0_4_ = auVar81._0_4_ * fVar49;
                fVar63 = auVar145._4_4_;
                auVar82._4_4_ = auVar81._4_4_ * fVar63;
                fVar93 = auVar145._8_4_;
                auVar82._8_4_ = auVar81._8_4_ * fVar93;
                fVar94 = auVar145._12_4_;
                auVar82._12_4_ = auVar81._12_4_ * fVar94;
                auVar145 = vsubps_avx(auVar214,auVar82);
                auVar79._0_4_ = fVar49 + fVar49 * auVar145._0_4_;
                auVar79._4_4_ = fVar63 + fVar63 * auVar145._4_4_;
                auVar79._8_4_ = fVar93 + fVar93 * auVar145._8_4_;
                auVar79._12_4_ = fVar94 + fVar94 * auVar145._12_4_;
                break;
              case 5:
                auVar204._8_4_ = 0x42b0c0a5;
                auVar204._0_8_ = 0x42b0c0a542b0c0a5;
                auVar204._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar79,auVar204);
                auVar266._8_4_ = 0xc2b0c0a5;
                auVar266._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar266._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar266,auVar145);
                auVar276._0_4_ = auVar208._0_4_ * 1.442695 + fVar49;
                auVar276._4_4_ = auVar208._4_4_ * 1.442695 + fVar63;
                auVar276._8_4_ = auVar208._8_4_ * 1.442695 + fVar93;
                auVar276._12_4_ = auVar208._12_4_ * 1.442695 + fVar94;
                auVar295._0_4_ = (int)auVar276._0_4_;
                auVar295._4_4_ = (int)auVar276._4_4_;
                auVar295._8_4_ = (int)auVar276._8_4_;
                auVar295._12_4_ = (int)auVar276._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar295);
                auVar145 = vcmpps_avx(auVar276,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar214);
                auVar145 = vsubps_avx(auVar217,auVar145);
                auVar296._0_4_ = auVar145._0_4_ * 0.6931472;
                auVar296._4_4_ = auVar145._4_4_ * 0.6931472;
                auVar296._8_4_ = auVar145._8_4_ * 0.6931472;
                auVar296._12_4_ = auVar145._12_4_ * 0.6931472;
                auVar217 = vsubps_avx(auVar208,auVar296);
                fVar198 = auVar217._0_4_;
                fVar144 = auVar217._4_4_;
                fVar191 = auVar217._8_4_;
                fVar192 = auVar217._12_4_;
                auVar235._0_4_ = (int)auVar145._0_4_;
                auVar235._4_4_ = (int)auVar145._4_4_;
                auVar235._8_4_ = (int)auVar145._8_4_;
                auVar235._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar235,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar214);
                auVar236._0_4_ =
                     (fVar198 + 1.0 +
                     fVar198 * fVar198 *
                     (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) * fVar198
                       + 0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar49)) * auVar145._0_4_
                     + 1.0;
                auVar236._4_4_ =
                     (fVar144 + 1.0 +
                     fVar144 * fVar144 *
                     (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144
                       + 0.041665796) * fVar144 + 0.16666666) * fVar144 + fVar63)) * auVar145._4_4_
                     + 1.0;
                auVar236._8_4_ =
                     (fVar191 + 1.0 +
                     fVar191 * fVar191 *
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + fVar93)) * auVar145._8_4_
                     + 1.0;
                auVar236._12_4_ =
                     (fVar192 + 1.0 +
                     fVar192 * fVar192 *
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar94)) * auVar145._12_4_
                     + 1.0;
                auVar114._8_4_ = 0x800000;
                auVar114._0_8_ = 0x80000000800000;
                auVar114._12_4_ = 0x800000;
                auVar145 = vmaxps_avx(auVar236,auVar114);
                auVar217 = vpsrld_avx(auVar145,0x17);
                auVar166._8_4_ = 0xffffff82;
                auVar166._0_8_ = 0xffffff82ffffff82;
                auVar166._12_4_ = 0xffffff82;
                auVar217 = vpaddd_avx(auVar217,auVar166);
                auVar167._8_4_ = 0x807fffff;
                auVar167._0_8_ = 0x807fffff807fffff;
                auVar167._12_4_ = 0x807fffff;
                auVar145 = vandps_avx(auVar145,auVar167);
                auVar263 = vorps_avx(auVar145,auVar92._0_16_);
                auVar208 = vcvtdq2ps_avx(auVar217);
                auVar168._8_4_ = 0x3f3504f3;
                auVar168._0_8_ = 0x3f3504f33f3504f3;
                auVar168._12_4_ = 0x3f3504f3;
                auVar217 = vcmpps_avx(auVar263,auVar168,1);
                auVar145 = vandps_avx(auVar217,auVar263);
                fVar198 = auVar263._0_4_ + -1.0 + auVar145._0_4_;
                fVar144 = auVar263._4_4_ + -1.0 + auVar145._4_4_;
                fVar191 = auVar263._8_4_ + -1.0 + auVar145._8_4_;
                fVar192 = auVar263._12_4_ + -1.0 + auVar145._12_4_;
                auVar145 = vandps_avx(auVar217,auVar214);
                auVar217 = vsubps_avx(auVar208,auVar145);
                auVar145 = vcmpps_avx(auVar236,_DAT_00516060,2);
                auVar115._0_4_ =
                     (fVar198 * fVar198 *
                      (((((((((fVar198 * 0.070376836 + -0.1151461) * fVar198 + 0.116769984) *
                             fVar198 + -0.12420141) * fVar198 + 0.14249323) * fVar198 + -0.16668057)
                          * fVar198 + 0.20000714) * fVar198 + -0.24999994) * fVar198 + 0.3333333) *
                       fVar198 + -0.5) + auVar217._0_4_ * 0.6931472 + fVar198) * -2.0;
                auVar115._4_4_ =
                     (fVar144 * fVar144 *
                      (((((((((fVar144 * 0.070376836 + -0.1151461) * fVar144 + 0.116769984) *
                             fVar144 + -0.12420141) * fVar144 + 0.14249323) * fVar144 + -0.16668057)
                          * fVar144 + 0.20000714) * fVar144 + -0.24999994) * fVar144 + 0.3333333) *
                       fVar144 + -0.5) + auVar217._4_4_ * 0.6931472 + fVar144) * -2.0;
                auVar115._8_4_ =
                     (fVar191 * fVar191 *
                      (((((((((fVar191 * 0.070376836 + -0.1151461) * fVar191 + 0.116769984) *
                             fVar191 + -0.12420141) * fVar191 + 0.14249323) * fVar191 + -0.16668057)
                          * fVar191 + 0.20000714) * fVar191 + -0.24999994) * fVar191 + 0.3333333) *
                       fVar191 + -0.5) + auVar217._8_4_ * 0.6931472 + fVar191) * -2.0;
                auVar115._12_4_ =
                     (fVar192 * fVar192 *
                      (((((((((fVar192 * 0.070376836 + -0.1151461) * fVar192 + 0.116769984) *
                             fVar192 + -0.12420141) * fVar192 + 0.14249323) * fVar192 + -0.16668057)
                          * fVar192 + 0.20000714) * fVar192 + -0.24999994) * fVar192 + 0.3333333) *
                       fVar192 + -0.5) + auVar217._12_4_ * 0.6931472 + fVar192) * -2.0;
                auVar169._8_4_ = 0x7fffffff;
                auVar169._0_8_ = 0x7fffffff7fffffff;
                auVar169._12_4_ = 0x7fffffff;
                auVar145 = vblendvps_avx(auVar115,auVar169,auVar145);
                auVar170._8_4_ = 0x42b0c0a5;
                auVar170._0_8_ = 0x42b0c0a542b0c0a5;
                auVar170._12_4_ = 0x42b0c0a5;
                auVar145 = vminps_avx(auVar145,auVar170);
                auVar171._8_4_ = 0xc2b0c0a5;
                auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar171._12_4_ = 0xc2b0c0a5;
                auVar208 = vmaxps_avx(auVar145,auVar171);
                auVar172._0_4_ = auVar208._0_4_ * 1.442695 + fVar49;
                auVar172._4_4_ = auVar208._4_4_ * 1.442695 + fVar63;
                auVar172._8_4_ = auVar208._8_4_ * 1.442695 + fVar93;
                auVar172._12_4_ = auVar208._12_4_ * 1.442695 + fVar94;
                auVar237._0_4_ = (int)auVar172._0_4_;
                auVar237._4_4_ = (int)auVar172._4_4_;
                auVar237._8_4_ = (int)auVar172._8_4_;
                auVar237._12_4_ = (int)auVar172._12_4_;
                auVar217 = vcvtdq2ps_avx(auVar237);
                auVar145 = vcmpps_avx(auVar172,auVar217,1);
                auVar145 = vandps_avx(auVar145,auVar214);
                auVar145 = vsubps_avx(auVar217,auVar145);
                auVar238._0_4_ = auVar145._0_4_ * 0.6931472;
                auVar238._4_4_ = auVar145._4_4_ * 0.6931472;
                auVar238._8_4_ = auVar145._8_4_ * 0.6931472;
                auVar238._12_4_ = auVar145._12_4_ * 0.6931472;
                auVar217 = vsubps_avx(auVar208,auVar238);
                fVar198 = auVar217._0_4_;
                fVar144 = auVar217._4_4_;
                fVar191 = auVar217._8_4_;
                fVar192 = auVar217._12_4_;
                auVar92 = ZEXT1664(auVar92._0_16_);
                auVar173._0_4_ = (int)auVar145._0_4_;
                auVar173._4_4_ = (int)auVar145._4_4_;
                auVar173._8_4_ = (int)auVar145._8_4_;
                auVar173._12_4_ = (int)auVar145._12_4_;
                auVar145 = vpslld_avx(auVar173,0x17);
                auVar145 = vpaddd_avx(auVar145,auVar214);
                auVar116._0_4_ =
                     (fVar198 + 1.0 +
                     (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) * fVar198
                       + 0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar49) *
                     fVar198 * fVar198) * auVar145._0_4_ + 1.0;
                auVar116._4_4_ =
                     (fVar144 + 1.0 +
                     (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) * fVar144
                       + 0.041665796) * fVar144 + 0.16666666) * fVar144 + fVar63) *
                     fVar144 * fVar144) * auVar145._4_4_ + 1.0;
                auVar116._8_4_ =
                     (fVar191 + 1.0 +
                     (((((fVar191 * 0.00019875691 + 0.0013981999) * fVar191 + 0.008333452) * fVar191
                       + 0.041665796) * fVar191 + 0.16666666) * fVar191 + fVar93) *
                     fVar191 * fVar191) * auVar145._8_4_ + 1.0;
                auVar116._12_4_ =
                     (fVar192 + 1.0 +
                     (((((fVar192 * 0.00019875691 + 0.0013981999) * fVar192 + 0.008333452) * fVar192
                       + 0.041665796) * fVar192 + 0.16666666) * fVar192 + fVar94) *
                     fVar192 * fVar192) * auVar145._12_4_ + 1.0;
                auVar145 = vrcpps_avx(auVar116);
                fVar49 = auVar145._0_4_;
                fVar63 = auVar145._4_4_;
                fVar93 = auVar145._8_4_;
                fVar94 = auVar145._12_4_;
                auVar117._0_4_ = auVar116._0_4_ * (fVar49 + fVar49);
                auVar117._4_4_ = auVar116._4_4_ * (fVar63 + fVar63);
                auVar117._8_4_ = auVar116._8_4_ * (fVar93 + fVar93);
                auVar117._12_4_ = auVar116._12_4_ * (fVar94 + fVar94);
                auVar205._8_4_ = 0x40000000;
                auVar205._0_8_ = 0x4000000040000000;
                auVar205._12_4_ = 0x40000000;
                auVar145 = vsubps_avx(auVar205,auVar117);
                auVar118._0_4_ = fVar49 + fVar49 + -1.0 + fVar49 * auVar145._0_4_;
                auVar118._4_4_ = fVar63 + fVar63 + -1.0 + fVar63 * auVar145._4_4_;
                auVar118._8_4_ = fVar93 + fVar93 + -1.0 + fVar93 * auVar145._8_4_;
                auVar118._12_4_ = fVar94 + fVar94 + -1.0 + fVar94 * auVar145._12_4_;
                goto LAB_004fd823;
              case 6:
                fVar49 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar63 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar121._0_4_ = fVar49 * auVar79._0_4_ + fVar63;
                auVar121._4_4_ = fVar49 * fVar199 + fVar63;
                auVar121._8_4_ = fVar49 * fVar95 + fVar63;
                auVar121._12_4_ = fVar49 * fVar196 + fVar63;
                auVar145 = vmaxps_avx(auVar121,_DAT_00516060);
                auVar118 = vminps_avx(auVar145,auVar214);
LAB_004fd823:
                auVar79._0_4_ = auVar118._0_4_ * auVar79._0_4_;
                auVar79._4_4_ = auVar118._4_4_ * fVar199;
                auVar79._8_4_ = auVar118._8_4_ * fVar95;
                auVar79._12_4_ = auVar118._12_4_ * fVar196;
              }
              *pauVar35 = auVar79;
              pauVar35 = pauVar35 + 1;
              bVar45 = iVar30 != iVar3;
              iVar30 = iVar30 + 1;
            } while (bVar45);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar27);
      }
      if (iVar2 == 4 && (bVar44 && bVar46)) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_50 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_58 = (this->weight_data_packed).data;
        local_38 = (ulong)uVar27;
        local_100 = 0;
        do {
          pvVar25 = local_40;
          pvVar8 = local_a8.data;
          if (-1 < iVar3) {
            lVar40 = local_48 * local_100;
            pfVar32 = (float *)(local_50 * local_100 + (long)local_58);
            lVar42 = (long)local_a8.w * local_a8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar30 = 0;
            uVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar92 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           local_100 * 4));
              }
              auVar145 = auVar92._0_16_;
              if (0 < iVar26) {
                p_Var7 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)pvVar8 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar30) * 4);
                uVar36 = 0;
                pfVar31 = pfVar32;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar38 = pfVar43;
                    iVar39 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      auVar54._0_4_ = *pfVar31 * *pfVar38;
                      auVar54._4_4_ = pfVar31[1] * pfVar38[1];
                      auVar54._8_4_ = pfVar31[2] * pfVar38[2];
                      auVar54._12_4_ = pfVar31[3] * pfVar38[3];
                      auVar145 = vshufpd_avx(auVar54,auVar54,1);
                      auVar55._0_4_ = auVar145._0_4_ + auVar54._0_4_;
                      auVar55._4_4_ = auVar145._4_4_ + auVar54._4_4_;
                      auVar55._8_4_ = auVar145._8_4_ + auVar54._8_4_;
                      auVar55._12_4_ = auVar145._12_4_ + auVar54._12_4_;
                      auVar145 = vmovshdup_avx(auVar55);
                      auVar92 = ZEXT464((uint)(auVar145._0_4_ + auVar92._0_4_ + auVar55._0_4_));
                      pfVar31 = pfVar31 + 4;
                      pfVar38 = pfVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar145 = auVar92._0_16_;
                  uVar36 = uVar36 + 1;
                  pfVar43 = (float *)((long)pfVar43 + lVar42);
                } while (uVar36 != uVar41);
              }
              fVar63 = auVar145._0_4_;
              fVar49 = fVar63;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar145 = vmaxss_avx(auVar145,ZEXT416(0));
                fVar49 = auVar145._0_4_;
                break;
              case 2:
                auVar145 = vcmpss_avx(ZEXT816(0) << 0x40,auVar145,1);
                auVar123._8_4_ = 0x3f800000;
                auVar123._0_8_ = 0x3f8000003f800000;
                auVar123._12_4_ = 0x3f800000;
                auVar145 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar123,auVar145);
                fVar94 = auVar145._0_4_;
LAB_004fdacd:
                fVar49 = fVar94 * fVar63;
                break;
              case 3:
                fVar63 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar145 = vmaxss_avx(auVar145,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                fVar49 = auVar145._0_4_;
                if (fVar63 < auVar145._0_4_) {
                  fVar49 = fVar63;
                }
                break;
              case 4:
                auVar145 = vminss_avx(auVar145,ZEXT416(0x42b0c0a5));
                auVar83._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar83._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar83._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar145 = vcmpss_avx(auVar145,ZEXT416(0xc2b0c0a5),1);
                auVar122._8_4_ = 0x42b0c0a5;
                auVar122._0_8_ = 0x42b0c0a542b0c0a5;
                auVar122._12_4_ = 0x42b0c0a5;
                auVar145 = vblendvps_avx(auVar83,auVar122,auVar145);
                fVar49 = expf(auVar145._0_4_);
                fVar49 = 1.0 / (fVar49 + 1.0);
                break;
              case 5:
                fVar49 = expf(fVar63);
                fVar49 = logf(fVar49 + 1.0);
                fVar49 = tanhf(fVar49);
                fVar49 = fVar49 * fVar63;
                break;
              case 6:
                fVar93 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar94 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar199 = -fVar94 / fVar93;
                fVar49 = 0.0;
                if ((fVar199 <= fVar63) && (fVar49 = fVar63, fVar63 <= fVar199 + 1.0 / fVar93)) {
                  fVar94 = fVar93 * fVar63 + fVar94;
                  goto LAB_004fdacd;
                }
              }
              *(float *)((long)pvVar25 + uVar37 * 4 + lVar40) = fVar49;
              uVar37 = uVar37 + 1;
              iVar30 = iVar30 + 4;
            } while (uVar37 != _w);
          }
          local_100 = local_100 + 1;
        } while (local_100 != local_38);
      }
      if ((bVar44 && bVar46) && iVar2 == 1) {
        pvVar8 = top_blob->data;
        iVar2 = top_blob->w;
        sVar9 = top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar37 = 0;
        do {
          pvVar25 = local_a8.data;
          if (-1 < iVar3) {
            lVar40 = (long)local_a8.w * local_a8.elemsize;
            uVar36 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar92 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           uVar37 * 4));
              }
              auVar145 = auVar92._0_16_;
              if (0 < iVar26) {
                iVar30 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                pfVar43 = (float *)((long)((int)uVar37 * iVar26 * iVar30) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var4));
                pfVar32 = (float *)((long)(_func_int ***)pvVar25 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)uVar36)
                                   * 4);
                uVar33 = 0;
                do {
                  if (0 < iVar30) {
                    pfVar31 = pfVar32;
                    iVar39 = iVar30;
                    do {
                      auVar92 = ZEXT464((uint)(*pfVar43 * *pfVar31 + auVar92._0_4_));
                      pfVar43 = pfVar43 + 1;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar145 = auVar92._0_16_;
                  uVar33 = uVar33 + 1;
                  pfVar32 = (float *)((long)pfVar32 + lVar40);
                } while (uVar33 != uVar41);
              }
              fVar63 = auVar145._0_4_;
              fVar49 = fVar63;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar145 = vmaxss_avx(auVar145,ZEXT416(0));
                fVar49 = auVar145._0_4_;
                break;
              case 2:
                auVar145 = vcmpss_avx(ZEXT816(0) << 0x40,auVar145,1);
                auVar125._8_4_ = 0x3f800000;
                auVar125._0_8_ = 0x3f8000003f800000;
                auVar125._12_4_ = 0x3f800000;
                auVar145 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar125,auVar145);
                fVar94 = auVar145._0_4_;
LAB_004fdd73:
                fVar49 = fVar94 * fVar63;
                break;
              case 3:
                fVar63 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar145 = vmaxss_avx(auVar145,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                fVar49 = auVar145._0_4_;
                if (fVar63 < auVar145._0_4_) {
                  fVar49 = fVar63;
                }
                break;
              case 4:
                auVar145 = vminss_avx(auVar145,ZEXT416(0x42b0c0a5));
                auVar84._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar84._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar84._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar145 = vcmpss_avx(auVar145,ZEXT416(0xc2b0c0a5),1);
                auVar124._8_4_ = 0x42b0c0a5;
                auVar124._0_8_ = 0x42b0c0a542b0c0a5;
                auVar124._12_4_ = 0x42b0c0a5;
                auVar145 = vblendvps_avx(auVar84,auVar124,auVar145);
                fVar49 = expf(auVar145._0_4_);
                fVar49 = 1.0 / (fVar49 + 1.0);
                break;
              case 5:
                fVar49 = expf(fVar63);
                fVar49 = logf(fVar49 + 1.0);
                fVar49 = tanhf(fVar49);
                fVar49 = fVar49 * fVar63;
                break;
              case 6:
                fVar93 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar94 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar199 = -fVar94 / fVar93;
                fVar49 = 0.0;
                if ((fVar199 <= fVar63) && (fVar49 = fVar63, fVar63 <= fVar199 + 1.0 / fVar93)) {
                  fVar94 = fVar93 * fVar63 + fVar94;
                  goto LAB_004fdd73;
                }
              }
              *(float *)((long)pvVar8 + uVar36 * 4 + (long)iVar2 * sVar9 * uVar37) = fVar49;
              uVar36 = uVar36 + 1;
            } while (uVar36 != _w);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != uVar27);
      }
      iVar39 = 0;
    }
  }
  piVar24 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}